

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::multiaggregation(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp,bool *again)

{
  undefined8 *puVar1;
  uint *puVar2;
  double a;
  bool bVar3;
  undefined1 uVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  int iVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  fpclass_type fVar10;
  int32_t iVar11;
  uint uVar12;
  Item *pIVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  SPxOut *pSVar16;
  char cVar17;
  uint uVar18;
  uint uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  bool bVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  MultiAggregationPS *this_00;
  Item *pIVar30;
  ulong uVar31;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar32;
  cpp_dec_float<50U,_int,_void> *pcVar33;
  int iVar34;
  fpclass_type fVar35;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar37;
  int *piVar38;
  long lVar39;
  byte bVar40;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar41;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar42;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar43;
  bool bVar44;
  pointer pnVar45;
  long lVar46;
  cpp_dec_float<50U,_int,_void> *pcVar47;
  cpp_dec_float<50U,_int,_void> *pcVar48;
  Item *this_01;
  type *ptVar49;
  long lVar50;
  uint uVar51;
  long lVar52;
  ulong uVar53;
  long in_FS_OFFSET;
  bool bVar54;
  type t;
  uint local_980;
  int local_97c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRes;
  ulong local_940;
  int local_938;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minRes;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  updateRow;
  cpp_dec_float<50U,_int,_void> local_708;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  shared_ptr<soplex::Tolerances> local_688;
  fpclass_type local_678;
  int32_t iStack_674;
  undefined8 uStack_670;
  bool *local_668;
  long local_660;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_658;
  ulong local_650;
  uint local_648 [2];
  uint auStack_640 [2];
  uint local_638 [2];
  uint auStack_630 [2];
  uint local_628 [4];
  uint local_618 [2];
  uint auStack_610 [2];
  uint local_608 [2];
  uint auStack_600 [2];
  uint local_5f8 [4];
  uint local_5e8 [2];
  uint auStack_5e0 [2];
  uint local_5d8 [2];
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  uint local_5b8 [2];
  uint auStack_5b0 [2];
  uint local_5a8 [2];
  undefined8 uStack_5a0;
  undefined8 local_598;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  cpp_dec_float<50U,_int,_void> local_548;
  element_type *local_508;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_500;
  uint local_4f8 [2];
  uint auStack_4f0 [2];
  uint local_4e8 [2];
  int local_4e0;
  bool local_4dc;
  fpclass_type local_4d8;
  int32_t local_4d4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  cpp_dec_float<50U,_int,_void> local_488;
  element_type *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_440;
  uint local_438 [2];
  uint auStack_430 [2];
  uint local_428 [2];
  int local_420;
  bool local_41c;
  fpclass_type local_418;
  int32_t local_414;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  undefined8 uVar36;
  
  local_660 = (long)(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
  iVar29 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  local_668 = again;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&upLocks,iVar29);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&downLocks,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  local_940 = (ulong)(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
  if ((long)local_940 < 1) {
    local_97c = 0;
    local_938 = 0;
    iVar28 = 0;
  }
  else {
    a = *(double *)(in_FS_OFFSET + -8);
    local_658 = &this->m_hist;
    iVar28 = 0;
    local_938 = 0;
    local_97c = 0;
    do {
      local_650 = local_940;
      local_940 = local_940 - 1;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&upLocks.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend,0);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&downLocks.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend,0);
      pIVar13 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      iVar23 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[local_940].idx;
      if (1 < pIVar13[iVar23].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar13 = pIVar13 + iVar23;
        if (0 < (pIVar13->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused) {
          lVar50 = 0;
          lVar52 = 0;
          do {
            pNVar43 = (pIVar13->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            uVar14 = *(undefined8 *)((long)(pNVar43->val).m_backend.data._M_elems + lVar50 + 0x20);
            lhs.m_backend.data._M_elems._32_5_ = SUB85(uVar14,0);
            lhs.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            puVar2 = (uint *)((long)(pNVar43->val).m_backend.data._M_elems + lVar50);
            lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            lhs.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)(pNVar43->val).m_backend.data._M_elems + lVar50 + 0x10);
            lhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar14 = *(undefined8 *)(puVar2 + 2);
            lhs.m_backend.data._M_elems._24_5_ = SUB85(uVar14,0);
            lhs.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            lhs.m_backend.exp = *(int *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar50);
            lhs.m_backend.neg = *(bool *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar50 + 4);
            lhs.m_backend._48_8_ =
                 *(undefined8 *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar50 + 8);
            pcVar48 = &(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&((pIVar13->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .m_elem)->val + 1) + lVar50)].m_backend;
            ::soplex::infinity::__tls_init();
            t.m_backend.fpclass = cpp_dec_float_finite;
            t.m_backend.prec_elem = 10;
            t.m_backend.data._M_elems[0] = 0;
            t.m_backend.data._M_elems[1] = 0;
            t.m_backend.data._M_elems[2] = 0;
            t.m_backend.data._M_elems[3] = 0;
            t.m_backend.data._M_elems[4] = 0;
            t.m_backend.data._M_elems[5] = 0;
            t.m_backend.data._M_elems._24_5_ = 0;
            t.m_backend.data._M_elems[7]._1_3_ = 0;
            t.m_backend.data._M_elems._32_5_ = 0;
            t.m_backend.data._M_elems[9]._1_3_ = 0;
            t.m_backend.exp = 0;
            t.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&t,-a);
            if (((pcVar48->fpclass == cpp_dec_float_NaN) ||
                (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar48,&t.m_backend), iVar23 < 1)) {
LAB_002f2bcc:
              pcVar48 = &(lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).left.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&((pIVar13->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           .m_elem)->val + 1) + lVar50)].m_backend;
              ::soplex::infinity::__tls_init();
              t.m_backend.fpclass = cpp_dec_float_finite;
              t.m_backend.prec_elem = 10;
              t.m_backend.data._M_elems[0] = 0;
              t.m_backend.data._M_elems[1] = 0;
              t.m_backend.data._M_elems[2] = 0;
              t.m_backend.data._M_elems[3] = 0;
              t.m_backend.data._M_elems[4] = 0;
              t.m_backend.data._M_elems[5] = 0;
              t.m_backend.data._M_elems._24_5_ = 0;
              t.m_backend.data._M_elems[7]._1_3_ = 0;
              t.m_backend.data._M_elems._32_5_ = 0;
              t.m_backend.data._M_elems[9]._1_3_ = 0;
              t.m_backend.exp = 0;
              t.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&t,-a);
              if (((pcVar48->fpclass == cpp_dec_float_NaN) ||
                  (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
                 (iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar48,&t.m_backend), iVar23 < 1)) {
                pcVar48 = &(lp->
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).right.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start
                           [*(int *)((long)(&((pIVar13->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             .m_elem)->val + 1) + lVar50)].m_backend;
                ::soplex::infinity::__tls_init();
                t.m_backend.fpclass = cpp_dec_float_finite;
                t.m_backend.prec_elem = 10;
                t.m_backend.data._M_elems[0] = 0;
                t.m_backend.data._M_elems[1] = 0;
                t.m_backend.data._M_elems[2] = 0;
                t.m_backend.data._M_elems[3] = 0;
                t.m_backend.data._M_elems[4] = 0;
                t.m_backend.data._M_elems[5] = 0;
                t.m_backend.data._M_elems._24_5_ = 0;
                t.m_backend.data._M_elems[7]._1_3_ = 0;
                t.m_backend.data._M_elems._32_5_ = 0;
                t.m_backend.data._M_elems[9]._1_3_ = 0;
                t.m_backend.exp = 0;
                t.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&t,a);
                if (((pcVar48->fpclass != cpp_dec_float_NaN) &&
                    (t.m_backend.fpclass != cpp_dec_float_NaN)) &&
                   (iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (pcVar48,&t.m_backend), iVar23 < 0)) {
                  if (lhs.m_backend.fpclass != cpp_dec_float_NaN) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>(&t.m_backend,0,(type *)0x0);
                    iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&lhs.m_backend,&t.m_backend);
                    pnVar45 = upLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (0 < iVar23) {
                      t.m_backend.fpclass = cpp_dec_float_finite;
                      t.m_backend.prec_elem = 10;
                      t.m_backend.data._M_elems[0] = 0;
                      t.m_backend.data._M_elems[1] = 0;
                      t.m_backend.data._M_elems[2] = 0;
                      t.m_backend.data._M_elems[3] = 0;
                      t.m_backend.data._M_elems[4] = 0;
                      t.m_backend.data._M_elems[5] = 0;
                      t.m_backend.data._M_elems._24_5_ = 0;
                      t.m_backend.data._M_elems[7]._1_3_ = 0;
                      t.m_backend.data._M_elems._32_5_ = 0;
                      t.m_backend.data._M_elems[9]._1_3_ = 0;
                      t.m_backend.exp = 0;
                      t.m_backend.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      from_unsigned_long_long(&t.m_backend,1);
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                                (&pnVar45[local_940].m_backend,&t.m_backend);
                      goto LAB_002f2f28;
                    }
                  }
                  if (lhs.m_backend.fpclass != cpp_dec_float_NaN) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>(&t.m_backend,0,(type *)0x0);
                    iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&lhs.m_backend,&t.m_backend);
                    pnVar45 = downLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (iVar23 < 0) {
                      t.m_backend.fpclass = cpp_dec_float_finite;
                      t.m_backend.prec_elem = 10;
                      t.m_backend.data._M_elems[0] = 0;
                      t.m_backend.data._M_elems[1] = 0;
                      t.m_backend.data._M_elems[2] = 0;
                      t.m_backend.data._M_elems[3] = 0;
                      t.m_backend.data._M_elems[4] = 0;
                      t.m_backend.data._M_elems[5] = 0;
                      t.m_backend.data._M_elems._24_5_ = 0;
                      t.m_backend.data._M_elems[7]._1_3_ = 0;
                      t.m_backend.data._M_elems._32_5_ = 0;
                      t.m_backend.data._M_elems[9]._1_3_ = 0;
                      t.m_backend.exp = 0;
                      t.m_backend.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      from_unsigned_long_long(&t.m_backend,1);
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                                (&pnVar45[local_940].m_backend,&t.m_backend);
                    }
                  }
                }
              }
              else {
                if (lhs.m_backend.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&t.m_backend,0,(type *)0x0);
                  iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&lhs.m_backend,&t.m_backend);
                  pnVar45 = downLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (0 < iVar23) {
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    from_unsigned_long_long(&t.m_backend,1);
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                              (&pnVar45[local_940].m_backend,&t.m_backend);
                    goto LAB_002f2f28;
                  }
                }
                if (lhs.m_backend.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&t.m_backend,0,(type *)0x0);
                  iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&lhs.m_backend,&t.m_backend);
                  pnVar45 = upLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (iVar23 < 0) {
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    from_unsigned_long_long(&t.m_backend,1);
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                              (&pnVar45[local_940].m_backend,&t.m_backend);
                  }
                }
              }
            }
            else {
              pcVar48 = &(lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&((pIVar13->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           .m_elem)->val + 1) + lVar50)].m_backend;
              ::soplex::infinity::__tls_init();
              rhs.m_backend.fpclass = cpp_dec_float_finite;
              rhs.m_backend.prec_elem = 10;
              rhs.m_backend.data._M_elems[0] = 0;
              rhs.m_backend.data._M_elems[1] = 0;
              rhs.m_backend.data._M_elems[2] = 0;
              rhs.m_backend.data._M_elems[3] = 0;
              rhs.m_backend.data._M_elems[4] = 0;
              rhs.m_backend.data._M_elems[5] = 0;
              rhs.m_backend.data._M_elems._24_5_ = 0;
              rhs.m_backend.data._M_elems[7]._1_3_ = 0;
              rhs.m_backend.data._M_elems._32_5_ = 0;
              rhs.m_backend.data._M_elems[9]._1_3_ = 0;
              rhs.m_backend.exp = 0;
              rhs.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&rhs,a);
              if (((pcVar48->fpclass == cpp_dec_float_NaN) ||
                  (rhs.m_backend.fpclass == cpp_dec_float_NaN)) ||
                 (iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar48,&rhs.m_backend),
                 pnVar45 = upLocks.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start, -1 < iVar23))
              goto LAB_002f2bcc;
              t.m_backend.fpclass = cpp_dec_float_finite;
              t.m_backend.prec_elem = 10;
              t.m_backend.data._M_elems[0] = 0;
              t.m_backend.data._M_elems[1] = 0;
              t.m_backend.data._M_elems[2] = 0;
              t.m_backend.data._M_elems[3] = 0;
              t.m_backend.data._M_elems[4] = 0;
              t.m_backend.data._M_elems[5] = 0;
              t.m_backend.data._M_elems._24_5_ = 0;
              t.m_backend.data._M_elems[7]._1_3_ = 0;
              t.m_backend.data._M_elems._32_5_ = 0;
              t.m_backend.data._M_elems[9]._1_3_ = 0;
              t.m_backend.exp = 0;
              t.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              from_unsigned_long_long(&t.m_backend,1);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&pnVar45[local_940].m_backend,&t.m_backend);
              pnVar45 = downLocks.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              t.m_backend.fpclass = cpp_dec_float_finite;
              t.m_backend.prec_elem = 10;
              t.m_backend.data._M_elems[0] = 0;
              t.m_backend.data._M_elems[1] = 0;
              t.m_backend.data._M_elems[2] = 0;
              t.m_backend.data._M_elems[3] = 0;
              t.m_backend.data._M_elems[4] = 0;
              t.m_backend.data._M_elems[5] = 0;
              t.m_backend.data._M_elems._24_5_ = 0;
              t.m_backend.data._M_elems[7]._1_3_ = 0;
              t.m_backend.data._M_elems._32_5_ = 0;
              t.m_backend.data._M_elems[9]._1_3_ = 0;
              t.m_backend.exp = 0;
              t.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              from_unsigned_long_long(&t.m_backend,1);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&pnVar45[local_940].m_backend,&t.m_backend);
            }
LAB_002f2f28:
            lVar52 = lVar52 + 1;
            lVar50 = lVar50 + 0x3c;
          } while (lVar52 < (pIVar13->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused);
        }
        pnVar45 = upLocks.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (upLocks.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass ==
            cpp_dec_float_NaN) {
LAB_002f2f77:
          pnVar45 = downLocks.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (downLocks.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass !=
              cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&t.m_backend,1,(type *)0x0);
            iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&pnVar45[local_940].m_backend,&t.m_backend);
            if (iVar23 == 0) goto LAB_002f2fb4;
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,1,(type *)0x0);
          iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&pnVar45[local_940].m_backend,&t.m_backend);
          if (iVar23 != 0) goto LAB_002f2f77;
LAB_002f2fb4:
          pnVar45 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_5f8._0_8_ = *(undefined8 *)(pnVar45[local_940].m_backend.data._M_elems + 8);
          local_618 = pnVar45[local_940].m_backend.data._M_elems[0];
          auStack_610 = *(uint (*) [2])(pnVar45[local_940].m_backend.data._M_elems + 2);
          puVar2 = pnVar45[local_940].m_backend.data._M_elems + 4;
          local_608 = *(uint (*) [2])puVar2;
          auStack_600 = *(uint (*) [2])(puVar2 + 2);
          iVar23 = pnVar45[local_940].m_backend.exp;
          bVar3 = pnVar45[local_940].m_backend.neg;
          fVar5 = pnVar45[local_940].m_backend.fpclass;
          iVar6 = pnVar45[local_940].m_backend.prec_elem;
          pnVar45 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_628._0_8_ = *(undefined8 *)(pnVar45[local_940].m_backend.data._M_elems + 8);
          local_648 = pnVar45[local_940].m_backend.data._M_elems[0];
          auStack_640 = *(uint (*) [2])(pnVar45[local_940].m_backend.data._M_elems + 2);
          puVar2 = pnVar45[local_940].m_backend.data._M_elems + 4;
          local_638 = *(uint (*) [2])puVar2;
          auStack_630 = *(uint (*) [2])(puVar2 + 2);
          iVar34 = (int)local_940;
          if ((pIVar13->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused < 1) {
            bVar44 = true;
            local_980 = 0xffffffff;
          }
          else {
            iVar7 = pnVar45[local_940].m_backend.exp;
            bVar54 = pnVar45[local_940].m_backend.neg;
            fVar8 = pnVar45[local_940].m_backend.fpclass;
            iVar9 = pnVar45[local_940].m_backend.prec_elem;
            local_980 = 0xffffffff;
            bVar44 = true;
            lVar52 = 0;
            lVar50 = 0;
            do {
              pNVar43 = (pIVar13->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem;
              uVar14 = *(undefined8 *)((long)(pNVar43->val).m_backend.data._M_elems + lVar52 + 0x20)
              ;
              puVar1 = (undefined8 *)((long)(pNVar43->val).m_backend.data._M_elems + lVar52);
              ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)*puVar1;
              ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
              puVar2 = (uint *)((long)(pNVar43->val).m_backend.data._M_elems + lVar52 + 0x10);
              uVar15 = *(undefined8 *)puVar2;
              uVar20 = *(undefined8 *)(puVar2 + 2);
              iVar27 = *(int *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar52);
              uVar4 = *(undefined1 *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar52 + 4);
              fVar10 = *(fpclass_type *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar52 + 8);
              iVar11 = *(int32_t *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar52 + 0xc);
              iVar26 = *(int *)((long)(&pNVar43->val + 1) + lVar52);
              pnVar45 = (lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_3c8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)(pnVar45[iVar26].m_backend.data._M_elems + 8);
              lhs.m_backend.data._M_elems._32_5_ = local_3c8.m_backend.data._M_elems._32_5_;
              lhs.m_backend.data._M_elems[9]._1_3_ = local_3c8.m_backend.data._M_elems[9]._1_3_;
              lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar45[iVar26].m_backend.data;
              lhs.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)(pnVar45[iVar26].m_backend.data._M_elems + 2);
              puVar2 = pnVar45[iVar26].m_backend.data._M_elems + 4;
              lhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_3c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              lhs.m_backend.data._M_elems._24_5_ = local_3c8.m_backend.data._M_elems._24_5_;
              lhs.m_backend.data._M_elems[7]._1_3_ = local_3c8.m_backend.data._M_elems[7]._1_3_;
              lhs.m_backend.exp = pnVar45[iVar26].m_backend.exp;
              lhs.m_backend.neg = pnVar45[iVar26].m_backend.neg;
              local_3c8.m_backend.fpclass = pnVar45[iVar26].m_backend.fpclass;
              local_3c8.m_backend.prec_elem = pnVar45[iVar26].m_backend.prec_elem;
              lhs.m_backend.prec_elem = local_3c8.m_backend.prec_elem;
              lhs.m_backend.fpclass = local_3c8.m_backend.fpclass;
              pnVar45 = (lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_408.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)(pnVar45[iVar26].m_backend.data._M_elems + 8);
              rhs.m_backend.data._M_elems._32_5_ = local_408.m_backend.data._M_elems._32_5_;
              rhs.m_backend.data._M_elems[9]._1_3_ = local_408.m_backend.data._M_elems[9]._1_3_;
              rhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar45[iVar26].m_backend.data;
              rhs.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)(pnVar45[iVar26].m_backend.data._M_elems + 2);
              puVar2 = pnVar45[iVar26].m_backend.data._M_elems + 4;
              rhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_408.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              rhs.m_backend.data._M_elems._24_5_ = local_408.m_backend.data._M_elems._24_5_;
              rhs.m_backend.data._M_elems[7]._1_3_ = local_408.m_backend.data._M_elems[7]._1_3_;
              rhs.m_backend.exp = pnVar45[iVar26].m_backend.exp;
              rhs.m_backend.neg = pnVar45[iVar26].m_backend.neg;
              local_408.m_backend.fpclass = pnVar45[iVar26].m_backend.fpclass;
              local_408.m_backend.prec_elem = pnVar45[iVar26].m_backend.prec_elem;
              rhs.m_backend.prec_elem = local_408.m_backend.prec_elem;
              rhs.m_backend.fpclass = local_408.m_backend.fpclass;
              local_408.m_backend.data._M_elems._0_8_ = rhs.m_backend.data._M_elems._0_8_;
              local_408.m_backend.data._M_elems._8_8_ = rhs.m_backend.data._M_elems._8_8_;
              local_408.m_backend.data._M_elems._16_8_ = rhs.m_backend.data._M_elems._16_8_;
              local_408.m_backend.exp = rhs.m_backend.exp;
              local_408.m_backend.neg = rhs.m_backend.neg;
              local_3c8.m_backend.data._M_elems._0_8_ = lhs.m_backend.data._M_elems._0_8_;
              local_3c8.m_backend.data._M_elems._8_8_ = lhs.m_backend.data._M_elems._8_8_;
              local_3c8.m_backend.data._M_elems._16_8_ = lhs.m_backend.data._M_elems._16_8_;
              local_3c8.m_backend.exp = lhs.m_backend.exp;
              local_3c8.m_backend.neg = lhs.m_backend.neg;
              feastol(&local_68,this);
              bVar22 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                 (&local_3c8,&local_408,&local_68);
              iVar24 = 10;
              if (!bVar22) {
                ::soplex::infinity::__tls_init();
                t.m_backend.fpclass = cpp_dec_float_finite;
                t.m_backend.prec_elem = 10;
                t.m_backend.data._M_elems[0] = 0;
                t.m_backend.data._M_elems[1] = 0;
                t.m_backend.data._M_elems[2] = 0;
                t.m_backend.data._M_elems[3] = 0;
                t.m_backend.data._M_elems[4] = 0;
                t.m_backend.data._M_elems[5] = 0;
                t.m_backend.data._M_elems._24_5_ = 0;
                t.m_backend.data._M_elems[7]._1_3_ = 0;
                t.m_backend.data._M_elems._32_5_ = 0;
                t.m_backend.data._M_elems[9]._1_3_ = 0;
                t.m_backend.exp = 0;
                t.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&t.m_backend,-a);
                bVar22 = false;
                if ((lhs.m_backend.fpclass != cpp_dec_float_NaN) &&
                   (t.m_backend.fpclass != cpp_dec_float_NaN)) {
                  iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&lhs.m_backend,&t.m_backend);
                  bVar22 = 0 < iVar24;
                }
                ::soplex::infinity::__tls_init();
                t.m_backend.fpclass = cpp_dec_float_finite;
                t.m_backend.prec_elem = 10;
                t.m_backend.data._M_elems[0] = 0;
                t.m_backend.data._M_elems[1] = 0;
                t.m_backend.data._M_elems[2] = 0;
                t.m_backend.data._M_elems[3] = 0;
                t.m_backend.data._M_elems[4] = 0;
                t.m_backend.data._M_elems[5] = 0;
                t.m_backend.data._M_elems._24_5_ = 0;
                t.m_backend.data._M_elems[7]._1_3_ = 0;
                t.m_backend.data._M_elems._32_5_ = 0;
                t.m_backend.data._M_elems[9]._1_3_ = 0;
                t.m_backend.exp = 0;
                t.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&t.m_backend,a);
                bVar40 = 0;
                if ((rhs.m_backend.fpclass != cpp_dec_float_NaN) &&
                   (bVar40 = 0, t.m_backend.fpclass != cpp_dec_float_NaN)) {
                  iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&rhs.m_backend,&t.m_backend);
                  bVar40 = (byte)((uint)iVar24 >> 0x1f);
                }
                iVar24 = (lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[iVar26].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
                uVar51 = (iVar24 == 4) + 1;
                if (iVar24 == 3) {
                  uVar51 = 3;
                }
                uVar53 = (ulong)uVar51;
                if (iVar24 < 3) {
                  uVar53 = 0x7fffffff;
                }
                if (bVar22) {
                  pNVar43 = (pIVar13->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem;
                  if (*(int *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar52 + 8) == 2) {
LAB_002f3500:
                    pNVar43 = (pIVar13->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem;
                    if (*(int *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar52 + 8) == 2)
                    goto LAB_002f350c;
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                    iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)(pNVar43->val).m_backend.data._M_elems + lVar52),
                                        &t.m_backend);
                    if ((iVar24 < 0) &&
                       (pnVar45 = (lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).object.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                       pnVar45[local_940].m_backend.fpclass != cpp_dec_float_NaN)) {
                      t.m_backend.fpclass = cpp_dec_float_finite;
                      t.m_backend.prec_elem = 10;
                      t.m_backend.data._M_elems[0] = 0;
                      t.m_backend.data._M_elems[1] = 0;
                      t.m_backend.data._M_elems[2] = 0;
                      t.m_backend.data._M_elems[3] = 0;
                      t.m_backend.data._M_elems[4] = 0;
                      t.m_backend.data._M_elems[5] = 0;
                      t.m_backend.data._M_elems._24_5_ = 0;
                      t.m_backend.data._M_elems[7]._1_3_ = 0;
                      t.m_backend.data._M_elems._32_5_ = 0;
                      t.m_backend.data._M_elems[9]._1_3_ = 0;
                      t.m_backend.exp = 0;
                      t.m_backend.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                      iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&pnVar45[local_940].m_backend,&t.m_backend);
                      pnVar45 = upLocks.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      if (-1 < iVar24) {
                        if (upLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass
                            != cpp_dec_float_NaN) {
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<long_long>(&t.m_backend,1,(type *)0x0);
                          iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&pnVar45[local_940].m_backend,&t.m_backend);
                          pnVar45 = downLocks.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          if ((iVar24 == 0) &&
                             (downLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass
                              != cpp_dec_float_NaN)) {
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<long_long>(&t.m_backend,uVar53,(type *)0x0);
                            iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                     ::compare(&pnVar45[local_940].m_backend,&t.m_backend);
                            bVar22 = iVar24 < 1;
                            goto LAB_002f3646;
                          }
                        }
                        goto LAB_002f350c;
                      }
                    }
                    bVar22 = false;
                  }
                  else {
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                    iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)(pNVar43->val).m_backend.data._M_elems + lVar52),
                                        &t.m_backend);
                    if ((iVar24 < 1) ||
                       (pnVar45 = (lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).object.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                       pnVar45[local_940].m_backend.fpclass == cpp_dec_float_NaN))
                    goto LAB_002f3500;
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                    iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&pnVar45[local_940].m_backend,&t.m_backend);
                    pnVar45 = downLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((0 < iVar24) ||
                       (downLocks.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass ==
                        cpp_dec_float_NaN)) goto LAB_002f3500;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>(&t.m_backend,1,(type *)0x0);
                    iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&pnVar45[local_940].m_backend,&t.m_backend);
                    pnVar45 = upLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((iVar24 != 0) ||
                       (upLocks.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass ==
                        cpp_dec_float_NaN)) goto LAB_002f3500;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>(&t.m_backend,uVar53,(type *)0x0);
                    iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&pnVar45[local_940].m_backend,&t.m_backend);
                    if (0 < iVar24) goto LAB_002f3500;
                    bVar22 = true;
                  }
                }
                else {
LAB_002f350c:
                  bVar22 = false;
                }
LAB_002f3646:
                iVar24 = 0;
                uVar36 = 0;
                fVar35 = cpp_dec_float_finite;
                if (bVar40 != 0) {
                  pNVar43 = (pIVar13->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem;
                  if (*(int *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar52 + 8) != 2) {
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                    iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)(pNVar43->val).m_backend.data._M_elems + lVar52),
                                        &t.m_backend);
                    if ((0 < iVar25) &&
                       (pnVar45 = (lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).object.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                       pnVar45[local_940].m_backend.fpclass != cpp_dec_float_NaN)) {
                      t.m_backend.fpclass = cpp_dec_float_finite;
                      t.m_backend.prec_elem = 10;
                      t.m_backend.data._M_elems[0] = 0;
                      t.m_backend.data._M_elems[1] = 0;
                      t.m_backend.data._M_elems[2] = 0;
                      t.m_backend.data._M_elems[3] = 0;
                      t.m_backend.data._M_elems[4] = 0;
                      t.m_backend.data._M_elems[5] = 0;
                      t.m_backend.data._M_elems._24_5_ = 0;
                      t.m_backend.data._M_elems[7]._1_3_ = 0;
                      t.m_backend.data._M_elems._32_5_ = 0;
                      t.m_backend.data._M_elems[9]._1_3_ = 0;
                      t.m_backend.exp = 0;
                      t.m_backend.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                      iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&pnVar45[local_940].m_backend,&t.m_backend);
                      pnVar45 = upLocks.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      if ((-1 < iVar25) &&
                         (upLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass !=
                          cpp_dec_float_NaN)) {
                        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                        cpp_dec_float<long_long>(&t.m_backend,1,(type *)0x0);
                        iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&pnVar45[local_940].m_backend,&t.m_backend);
                        pnVar45 = downLocks.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if ((iVar25 == 0) &&
                           (downLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass
                            != cpp_dec_float_NaN)) {
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<long_long>(&t.m_backend,uVar53,(type *)0x0);
                          iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&pnVar45[local_940].m_backend,&t.m_backend);
                          if (iVar25 < 1) {
                            fVar35 = (fpclass_type)CONCAT71((int7)((ulong)uVar36 >> 8),1);
                            goto LAB_002f381c;
                          }
                        }
                      }
                    }
                  }
                  pNVar43 = (pIVar13->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem;
                  if (*(int *)((long)(&(pNVar43->val).m_backend.data + 1) + lVar52 + 8) == 2) {
LAB_002f3780:
                    fVar35 = cpp_dec_float_finite;
                  }
                  else {
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                    iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)(pNVar43->val).m_backend.data._M_elems + lVar52),
                                        &t.m_backend);
                    if ((iVar25 < 0) &&
                       (pnVar45 = (lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).object.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                       pnVar45[local_940].m_backend.fpclass != cpp_dec_float_NaN)) {
                      t.m_backend.fpclass = cpp_dec_float_finite;
                      t.m_backend.prec_elem = 10;
                      t.m_backend.data._M_elems[0] = 0;
                      t.m_backend.data._M_elems[1] = 0;
                      t.m_backend.data._M_elems[2] = 0;
                      t.m_backend.data._M_elems[3] = 0;
                      t.m_backend.data._M_elems[4] = 0;
                      t.m_backend.data._M_elems[5] = 0;
                      t.m_backend.data._M_elems._24_5_ = 0;
                      t.m_backend.data._M_elems[7]._1_3_ = 0;
                      t.m_backend.data._M_elems._32_5_ = 0;
                      t.m_backend.data._M_elems[9]._1_3_ = 0;
                      t.m_backend.exp = 0;
                      t.m_backend.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                      iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&pnVar45[local_940].m_backend,&t.m_backend);
                      pnVar45 = downLocks.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      if (iVar25 < 1) {
                        if (downLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass
                            != cpp_dec_float_NaN) {
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<long_long>(&t.m_backend,1,(type *)0x0);
                          iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&pnVar45[local_940].m_backend,&t.m_backend);
                          pnVar45 = upLocks.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          if ((iVar25 == 0) &&
                             (upLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_940].m_backend.fpclass
                              != cpp_dec_float_NaN)) {
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<long_long>(&t.m_backend,uVar53,(type *)0x0);
                            iVar25 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                     ::compare(&pnVar45[local_940].m_backend,&t.m_backend);
                            fVar35 = (fpclass_type)CONCAT71((int7)((ulong)uVar36 >> 8),iVar25 < 1);
                            goto LAB_002f381c;
                          }
                        }
                        goto LAB_002f3780;
                      }
                    }
                    fVar35 = cpp_dec_float_finite;
                  }
                }
LAB_002f381c:
                local_678 = fVar35;
                if ((byte)(bVar22 | (byte)fVar35) == 1) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&minRes.m_backend,0,(type *)0x0);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&maxRes.m_backend,0,(type *)0x0);
                  computeMinMaxResidualActivity
                            (this,lp,iVar26,iVar34,&minRes,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&maxRes.m_backend);
                  if (bVar22 != false) {
                    minVal.m_backend.fpclass = cpp_dec_float_finite;
                    minVal.m_backend.prec_elem = 10;
                    minVal.m_backend.data._M_elems[0] = 0;
                    minVal.m_backend.data._M_elems[1] = 0;
                    minVal.m_backend.data._M_elems[2] = 0;
                    minVal.m_backend.data._M_elems[3] = 0;
                    minVal.m_backend.data._M_elems[4] = 0;
                    minVal.m_backend.data._M_elems[5] = 0;
                    minVal.m_backend.data._M_elems._24_5_ = 0;
                    minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                    minVal.m_backend.data._M_elems._32_5_ = 0;
                    minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                    minVal.m_backend.exp = 0;
                    minVal.m_backend.neg = false;
                    maxVal.m_backend.fpclass = cpp_dec_float_finite;
                    maxVal.m_backend.prec_elem = 10;
                    maxVal.m_backend.data._M_elems[0] = 0;
                    maxVal.m_backend.data._M_elems[1] = 0;
                    maxVal.m_backend.data._M_elems[2] = 0;
                    maxVal.m_backend.data._M_elems[3] = 0;
                    maxVal.m_backend.data._M_elems[4] = 0;
                    maxVal.m_backend.data._M_elems[5] = 0;
                    maxVal.m_backend.data._M_elems._24_5_ = 0;
                    maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
                    maxVal.m_backend.data._M_elems._32_5_ = 0;
                    maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
                    maxVal.m_backend.exp = 0;
                    maxVal.m_backend.neg = false;
                    local_188.m_backend.data._M_elems[7]._1_3_ =
                         lhs.m_backend.data._M_elems[7]._1_3_;
                    local_188.m_backend.data._M_elems._24_5_ = lhs.m_backend.data._M_elems._24_5_;
                    local_188.m_backend.data._M_elems[0] = lhs.m_backend.data._M_elems[0];
                    local_188.m_backend.data._M_elems[1] = lhs.m_backend.data._M_elems[1];
                    local_188.m_backend.data._M_elems[2] = lhs.m_backend.data._M_elems[2];
                    local_188.m_backend.data._M_elems[3] = lhs.m_backend.data._M_elems[3];
                    local_188.m_backend.data._M_elems[4] = lhs.m_backend.data._M_elems[4];
                    local_188.m_backend.data._M_elems[5] = lhs.m_backend.data._M_elems[5];
                    local_188.m_backend.data._M_elems[9]._1_3_ =
                         lhs.m_backend.data._M_elems[9]._1_3_;
                    local_188.m_backend.data._M_elems._32_5_ = lhs.m_backend.data._M_elems._32_5_;
                    local_188.m_backend.exp = lhs.m_backend.exp;
                    local_188.m_backend.neg = lhs.m_backend.neg;
                    local_188.m_backend.fpclass = lhs.m_backend.fpclass;
                    local_188.m_backend.prec_elem = lhs.m_backend.prec_elem;
                    local_448 = ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                    p_Stack_440 = ptr.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
                    local_1c8.m_backend.data._M_elems[9]._1_3_ =
                         minRes.m_backend.data._M_elems[9]._1_3_;
                    local_1c8.m_backend.data._M_elems._32_5_ = minRes.m_backend.data._M_elems._32_5_
                    ;
                    local_1c8.m_backend.data._M_elems[7]._1_3_ =
                         minRes.m_backend.data._M_elems[7]._1_3_;
                    local_1c8.m_backend.data._M_elems._24_5_ = minRes.m_backend.data._M_elems._24_5_
                    ;
                    local_1c8.m_backend.data._M_elems[4] = minRes.m_backend.data._M_elems[4];
                    local_1c8.m_backend.data._M_elems[5] = minRes.m_backend.data._M_elems[5];
                    local_1c8.m_backend.data._M_elems[0] = minRes.m_backend.data._M_elems[0];
                    local_1c8.m_backend.data._M_elems[1] = minRes.m_backend.data._M_elems[1];
                    local_1c8.m_backend.data._M_elems[2] = minRes.m_backend.data._M_elems[2];
                    local_1c8.m_backend.data._M_elems[3] = minRes.m_backend.data._M_elems[3];
                    local_1c8.m_backend.exp = minRes.m_backend.exp;
                    local_1c8.m_backend.neg = minRes.m_backend.neg;
                    local_1c8.m_backend.fpclass = minRes.m_backend.fpclass;
                    local_1c8.m_backend.prec_elem = minRes.m_backend.prec_elem;
                    local_208.m_backend.data._M_elems[9]._1_3_ =
                         maxRes.m_backend.data._M_elems[9]._1_3_;
                    local_208.m_backend.data._M_elems._32_5_ = maxRes.m_backend.data._M_elems._32_5_
                    ;
                    local_208.m_backend.data._M_elems[7]._1_3_ =
                         maxRes.m_backend.data._M_elems[7]._1_3_;
                    local_208.m_backend.data._M_elems._24_5_ = maxRes.m_backend.data._M_elems._24_5_
                    ;
                    local_208.m_backend.data._M_elems[4] = maxRes.m_backend.data._M_elems[4];
                    local_208.m_backend.data._M_elems[5] = maxRes.m_backend.data._M_elems[5];
                    local_208.m_backend.data._M_elems[0] = maxRes.m_backend.data._M_elems[0];
                    local_208.m_backend.data._M_elems[1] = maxRes.m_backend.data._M_elems[1];
                    local_208.m_backend.data._M_elems[2] = maxRes.m_backend.data._M_elems[2];
                    local_208.m_backend.data._M_elems[3] = maxRes.m_backend.data._M_elems[3];
                    local_208.m_backend.exp = maxRes.m_backend.exp;
                    local_208.m_backend.neg = maxRes.m_backend.neg;
                    local_208.m_backend.fpclass = maxRes.m_backend.fpclass;
                    local_208.m_backend.prec_elem = maxRes.m_backend.prec_elem;
                    local_438 = (uint  [2])uVar15;
                    auStack_430 = (uint  [2])uVar20;
                    local_428 = (uint  [2])uVar14;
                    local_420 = iVar27;
                    local_41c = (bool)uVar4;
                    local_418 = fVar10;
                    local_414 = iVar11;
                    computeMinMaxValues(this,lp,&local_188,
                                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_448,&local_1c8,&local_208,&minVal,&maxVal);
                    ::soplex::infinity::__tls_init();
                    local_708.fpclass = cpp_dec_float_finite;
                    local_708.prec_elem = 10;
                    local_708.data._M_elems[0] = 0;
                    local_708.data._M_elems[1] = 0;
                    local_708.data._M_elems[2] = 0;
                    local_708.data._M_elems[3] = 0;
                    local_708.data._M_elems[4] = 0;
                    local_708.data._M_elems[5] = 0;
                    local_708.data._M_elems._24_5_ = 0;
                    local_708.data._M_elems[7]._1_3_ = 0;
                    local_708.data._M_elems._32_5_ = 0;
                    local_708.data._M_elems[9]._1_3_ = 0;
                    local_708.exp = 0;
                    local_708.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)&local_708,-a);
                    if (((minVal.m_backend.fpclass == cpp_dec_float_NaN) ||
                        (local_708.fpclass == cpp_dec_float_NaN)) ||
                       (iVar24 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&minVal.m_backend,&local_708),
                       uVar36 = minVal.m_backend._48_8_, bVar22 = minVal.m_backend.neg,
                       iVar26 = minVal.m_backend.exp, iVar24 < 1)) {
LAB_002f3e04:
                      iVar24 = 0;
                      bVar22 = true;
                    }
                    else {
                      local_598 = CONCAT35(minVal.m_backend.data._M_elems[9]._1_3_,
                                           minVal.m_backend.data._M_elems._32_5_);
                      uStack_5a0 = CONCAT35(minVal.m_backend.data._M_elems[7]._1_3_,
                                            minVal.m_backend.data._M_elems._24_5_);
                      local_5a8[0] = minVal.m_backend.data._M_elems[4];
                      local_5a8[1] = minVal.m_backend.data._M_elems[5];
                      local_5b8[0] = minVal.m_backend.data._M_elems[0];
                      local_5b8[1] = minVal.m_backend.data._M_elems[1];
                      auStack_5b0[0] = minVal.m_backend.data._M_elems[2];
                      auStack_5b0[1] = minVal.m_backend.data._M_elems[3];
                      local_488.data._M_elems[0] = local_618[0];
                      local_488.data._M_elems[1] = local_618[1];
                      local_488.data._M_elems[2] = auStack_610[0];
                      local_488.data._M_elems[3] = auStack_610[1];
                      local_488.data._M_elems[4] = local_608[0];
                      local_488.data._M_elems[5] = local_608[1];
                      local_488.data._M_elems[6] = auStack_600[0];
                      local_488.data._M_elems[7] = auStack_600[1];
                      local_488.data._M_elems[8] = local_5f8[0];
                      local_488.data._M_elems[9] = local_5f8[1];
                      local_488.exp = iVar23;
                      local_488.neg = bVar3;
                      local_488.fpclass = fVar5;
                      local_488.prec_elem = iVar6;
                      feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_110,this);
                      uVar21 = minVal.m_backend._48_8_;
                      t.m_backend.data._M_elems._32_5_ = SUB85(local_598,0);
                      t.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_598 >> 0x28);
                      t.m_backend.data._M_elems[4] = local_5a8[0];
                      t.m_backend.data._M_elems[5] = local_5a8[1];
                      t.m_backend.data._M_elems._24_5_ = SUB85(uStack_5a0,0);
                      t.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_5a0 >> 0x28);
                      t.m_backend.data._M_elems[0] = local_5b8[0];
                      t.m_backend.data._M_elems[1] = local_5b8[1];
                      t.m_backend.data._M_elems[2] = auStack_5b0[0];
                      t.m_backend.data._M_elems[3] = auStack_5b0[1];
                      t.m_backend.exp = iVar26;
                      t.m_backend.neg = bVar22;
                      minVal.m_backend.fpclass = (fpclass_type)uVar36;
                      minVal.m_backend.prec_elem = SUB84(uVar36,4);
                      t.m_backend.fpclass = minVal.m_backend.fpclass;
                      t.m_backend.prec_elem = minVal.m_backend.prec_elem;
                      minVal.m_backend._48_8_ = uVar21;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                                (&t.m_backend,&local_488);
                      if (((t.m_backend.fpclass == cpp_dec_float_NaN) ||
                          (local_110.fpclass == cpp_dec_float_NaN)) ||
                         (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&t.m_backend,&local_110), iVar26 < 1)) goto LAB_002f3e04;
                      ::soplex::infinity::__tls_init();
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&updateRow,a);
                      if ((maxVal.m_backend.fpclass == cpp_dec_float_NaN) ||
                         (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&maxVal.m_backend,
                                           (cpp_dec_float<50U,_int,_void> *)&updateRow), -1 < iVar26
                         )) goto LAB_002f3e04;
                      local_248.m_backend.data._M_elems[9]._1_3_ =
                           maxVal.m_backend.data._M_elems[9]._1_3_;
                      local_248.m_backend.data._M_elems._32_5_ =
                           maxVal.m_backend.data._M_elems._32_5_;
                      local_248.m_backend.data._M_elems[7]._1_3_ =
                           maxVal.m_backend.data._M_elems[7]._1_3_;
                      local_248.m_backend.data._M_elems._24_5_ =
                           maxVal.m_backend.data._M_elems._24_5_;
                      local_248.m_backend.data._M_elems[4] = maxVal.m_backend.data._M_elems[4];
                      local_248.m_backend.data._M_elems[5] = maxVal.m_backend.data._M_elems[5];
                      local_248.m_backend.data._M_elems[0] = maxVal.m_backend.data._M_elems[0];
                      local_248.m_backend.data._M_elems[1] = maxVal.m_backend.data._M_elems[1];
                      local_248.m_backend.data._M_elems[2] = maxVal.m_backend.data._M_elems[2];
                      local_248.m_backend.data._M_elems[3] = maxVal.m_backend.data._M_elems[3];
                      local_248.m_backend.exp = maxVal.m_backend.exp;
                      local_248.m_backend.neg = maxVal.m_backend.neg;
                      local_248.m_backend.fpclass = maxVal.m_backend.fpclass;
                      local_248.m_backend.prec_elem = maxVal.m_backend.prec_elem;
                      local_4c8.m_backend.data._M_elems[0] = local_648[0];
                      local_4c8.m_backend.data._M_elems[1] = local_648[1];
                      local_4c8.m_backend.data._M_elems[2] = auStack_640[0];
                      local_4c8.m_backend.data._M_elems[3] = auStack_640[1];
                      local_4c8.m_backend.data._M_elems[4] = local_638[0];
                      local_4c8.m_backend.data._M_elems[5] = local_638[1];
                      local_4c8.m_backend.data._M_elems[6] = auStack_630[0];
                      local_4c8.m_backend.data._M_elems[7] = auStack_630[1];
                      local_4c8.m_backend.data._M_elems[8] = local_628[0];
                      local_4c8.m_backend.data._M_elems[9] = local_628[1];
                      local_4c8.m_backend.exp = iVar7;
                      local_4c8.m_backend.neg = bVar54;
                      local_4c8.m_backend.fpclass = fVar8;
                      local_4c8.m_backend.prec_elem = iVar9;
                      feastol(&local_a0,this);
                      bVar22 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                         (&local_248,&local_4c8,&local_a0);
                      if (!bVar22) goto LAB_002f3e04;
                      local_980 = *(uint *)((long)(&((pIVar13->data).
                                                                                                          
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar52);
                      iVar24 = 8;
                      bVar44 = true;
                      bVar22 = false;
                    }
                    if (!bVar22) goto LAB_002f4273;
                  }
                  iVar24 = 0;
                  if ((undefined1)local_678 != '\0') {
                    minVal.m_backend.fpclass = cpp_dec_float_finite;
                    minVal.m_backend.prec_elem = 10;
                    minVal.m_backend.data._M_elems[0] = 0;
                    minVal.m_backend.data._M_elems[1] = 0;
                    minVal.m_backend.data._M_elems[2] = 0;
                    minVal.m_backend.data._M_elems[3] = 0;
                    minVal.m_backend.data._M_elems[4] = 0;
                    minVal.m_backend.data._M_elems[5] = 0;
                    minVal.m_backend.data._M_elems._24_5_ = 0;
                    minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                    minVal.m_backend.data._M_elems._32_5_ = 0;
                    minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                    minVal.m_backend.exp = 0;
                    minVal.m_backend.neg = false;
                    maxVal.m_backend.fpclass = cpp_dec_float_finite;
                    maxVal.m_backend.prec_elem = 10;
                    maxVal.m_backend.data._M_elems[0] = 0;
                    maxVal.m_backend.data._M_elems[1] = 0;
                    maxVal.m_backend.data._M_elems[2] = 0;
                    maxVal.m_backend.data._M_elems[3] = 0;
                    maxVal.m_backend.data._M_elems[4] = 0;
                    maxVal.m_backend.data._M_elems[5] = 0;
                    maxVal.m_backend.data._M_elems._24_5_ = 0;
                    maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
                    maxVal.m_backend.data._M_elems._32_5_ = 0;
                    maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
                    maxVal.m_backend.exp = 0;
                    maxVal.m_backend.neg = false;
                    local_288.m_backend.data._M_elems[7]._1_3_ =
                         rhs.m_backend.data._M_elems[7]._1_3_;
                    local_288.m_backend.data._M_elems._24_5_ = rhs.m_backend.data._M_elems._24_5_;
                    local_288.m_backend.data._M_elems[0] = rhs.m_backend.data._M_elems[0];
                    local_288.m_backend.data._M_elems[1] = rhs.m_backend.data._M_elems[1];
                    local_288.m_backend.data._M_elems[2] = rhs.m_backend.data._M_elems[2];
                    local_288.m_backend.data._M_elems[3] = rhs.m_backend.data._M_elems[3];
                    local_288.m_backend.data._M_elems[4] = rhs.m_backend.data._M_elems[4];
                    local_288.m_backend.data._M_elems[5] = rhs.m_backend.data._M_elems[5];
                    local_288.m_backend.data._M_elems[9]._1_3_ =
                         rhs.m_backend.data._M_elems[9]._1_3_;
                    local_288.m_backend.data._M_elems._32_5_ = rhs.m_backend.data._M_elems._32_5_;
                    local_288.m_backend.exp = rhs.m_backend.exp;
                    local_288.m_backend.neg = rhs.m_backend.neg;
                    local_288.m_backend.fpclass = rhs.m_backend.fpclass;
                    local_288.m_backend.prec_elem = rhs.m_backend.prec_elem;
                    local_508 = ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                    p_Stack_500 = ptr.
                                  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
                    local_2c8.m_backend.data._M_elems[9]._1_3_ =
                         minRes.m_backend.data._M_elems[9]._1_3_;
                    local_2c8.m_backend.data._M_elems._32_5_ = minRes.m_backend.data._M_elems._32_5_
                    ;
                    local_2c8.m_backend.data._M_elems[7]._1_3_ =
                         minRes.m_backend.data._M_elems[7]._1_3_;
                    local_2c8.m_backend.data._M_elems._24_5_ = minRes.m_backend.data._M_elems._24_5_
                    ;
                    local_2c8.m_backend.data._M_elems[4] = minRes.m_backend.data._M_elems[4];
                    local_2c8.m_backend.data._M_elems[5] = minRes.m_backend.data._M_elems[5];
                    local_2c8.m_backend.data._M_elems[0] = minRes.m_backend.data._M_elems[0];
                    local_2c8.m_backend.data._M_elems[1] = minRes.m_backend.data._M_elems[1];
                    local_2c8.m_backend.data._M_elems[2] = minRes.m_backend.data._M_elems[2];
                    local_2c8.m_backend.data._M_elems[3] = minRes.m_backend.data._M_elems[3];
                    local_2c8.m_backend.exp = minRes.m_backend.exp;
                    local_2c8.m_backend.neg = minRes.m_backend.neg;
                    local_2c8.m_backend.fpclass = minRes.m_backend.fpclass;
                    local_2c8.m_backend.prec_elem = minRes.m_backend.prec_elem;
                    local_308.m_backend.data._M_elems[9]._1_3_ =
                         maxRes.m_backend.data._M_elems[9]._1_3_;
                    local_308.m_backend.data._M_elems._32_5_ = maxRes.m_backend.data._M_elems._32_5_
                    ;
                    local_308.m_backend.data._M_elems[7]._1_3_ =
                         maxRes.m_backend.data._M_elems[7]._1_3_;
                    local_308.m_backend.data._M_elems._24_5_ = maxRes.m_backend.data._M_elems._24_5_
                    ;
                    local_308.m_backend.data._M_elems[4] = maxRes.m_backend.data._M_elems[4];
                    local_308.m_backend.data._M_elems[5] = maxRes.m_backend.data._M_elems[5];
                    local_308.m_backend.data._M_elems[0] = maxRes.m_backend.data._M_elems[0];
                    local_308.m_backend.data._M_elems[1] = maxRes.m_backend.data._M_elems[1];
                    local_308.m_backend.data._M_elems[2] = maxRes.m_backend.data._M_elems[2];
                    local_308.m_backend.data._M_elems[3] = maxRes.m_backend.data._M_elems[3];
                    local_308.m_backend.exp = maxRes.m_backend.exp;
                    local_308.m_backend.neg = maxRes.m_backend.neg;
                    local_308.m_backend.fpclass = maxRes.m_backend.fpclass;
                    local_308.m_backend.prec_elem = maxRes.m_backend.prec_elem;
                    local_4f8 = (uint  [2])uVar15;
                    auStack_4f0 = (uint  [2])uVar20;
                    local_4e8 = (uint  [2])uVar14;
                    local_4e0 = iVar27;
                    local_4dc = (bool)uVar4;
                    local_4d8 = fVar10;
                    local_4d4 = iVar11;
                    computeMinMaxValues(this,lp,&local_288,
                                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                         *)&local_508,&local_2c8,&local_308,&minVal,&maxVal);
                    ::soplex::infinity::__tls_init();
                    local_708.fpclass = cpp_dec_float_finite;
                    local_708.prec_elem = 10;
                    local_708.data._M_elems[0] = 0;
                    local_708.data._M_elems[1] = 0;
                    local_708.data._M_elems[2] = 0;
                    local_708.data._M_elems[3] = 0;
                    local_708.data._M_elems[4] = 0;
                    local_708.data._M_elems[5] = 0;
                    local_708.data._M_elems._24_5_ = 0;
                    local_708.data._M_elems[7]._1_3_ = 0;
                    local_708.data._M_elems._32_5_ = 0;
                    local_708.data._M_elems[9]._1_3_ = 0;
                    local_708.exp = 0;
                    local_708.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)&local_708,-a);
                    if (((minVal.m_backend.fpclass != cpp_dec_float_NaN) &&
                        (local_708.fpclass != cpp_dec_float_NaN)) &&
                       (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&minVal.m_backend,&local_708),
                       uVar14 = minVal.m_backend._48_8_, bVar22 = minVal.m_backend.neg,
                       iVar27 = minVal.m_backend.exp, 0 < iVar26)) {
                      local_5c8 = CONCAT35(minVal.m_backend.data._M_elems[9]._1_3_,
                                           minVal.m_backend.data._M_elems._32_5_);
                      uStack_5d0 = CONCAT35(minVal.m_backend.data._M_elems[7]._1_3_,
                                            minVal.m_backend.data._M_elems._24_5_);
                      local_5d8[0] = minVal.m_backend.data._M_elems[4];
                      local_5d8[1] = minVal.m_backend.data._M_elems[5];
                      local_5e8[0] = minVal.m_backend.data._M_elems[0];
                      local_5e8[1] = minVal.m_backend.data._M_elems[1];
                      auStack_5e0[0] = minVal.m_backend.data._M_elems[2];
                      auStack_5e0[1] = minVal.m_backend.data._M_elems[3];
                      local_548.data._M_elems[0] = local_618[0];
                      local_548.data._M_elems[1] = local_618[1];
                      local_548.data._M_elems[2] = auStack_610[0];
                      local_548.data._M_elems[3] = auStack_610[1];
                      local_548.data._M_elems[4] = local_608[0];
                      local_548.data._M_elems[5] = local_608[1];
                      local_548.data._M_elems[6] = auStack_600[0];
                      local_548.data._M_elems[7] = auStack_600[1];
                      local_548.data._M_elems[8] = local_5f8[0];
                      local_548.data._M_elems[9] = local_5f8[1];
                      local_548.exp = iVar23;
                      local_548.neg = bVar3;
                      local_548.fpclass = fVar5;
                      local_548.prec_elem = iVar6;
                      feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_148,this);
                      uVar15 = minVal.m_backend._48_8_;
                      t.m_backend.data._M_elems._32_5_ = SUB85(local_5c8,0);
                      t.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_5c8 >> 0x28);
                      t.m_backend.data._M_elems[4] = local_5d8[0];
                      t.m_backend.data._M_elems[5] = local_5d8[1];
                      t.m_backend.data._M_elems._24_5_ = SUB85(uStack_5d0,0);
                      t.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_5d0 >> 0x28);
                      t.m_backend.data._M_elems[0] = local_5e8[0];
                      t.m_backend.data._M_elems[1] = local_5e8[1];
                      t.m_backend.data._M_elems[2] = auStack_5e0[0];
                      t.m_backend.data._M_elems[3] = auStack_5e0[1];
                      t.m_backend.exp = iVar27;
                      t.m_backend.neg = bVar22;
                      minVal.m_backend.fpclass = (fpclass_type)uVar14;
                      minVal.m_backend.prec_elem = SUB84(uVar14,4);
                      t.m_backend.fpclass = minVal.m_backend.fpclass;
                      t.m_backend.prec_elem = minVal.m_backend.prec_elem;
                      minVal.m_backend._48_8_ = uVar15;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                                (&t.m_backend,&local_548);
                      if (((t.m_backend.fpclass != cpp_dec_float_NaN) &&
                          (local_148.fpclass != cpp_dec_float_NaN)) &&
                         (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&t.m_backend,&local_148), 0 < iVar27)) {
                        ::soplex::infinity::__tls_init();
                        updateRow.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        updateRow.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        updateRow.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                  ((cpp_dec_float<50u,int,void> *)&updateRow,a);
                        if ((maxVal.m_backend.fpclass != cpp_dec_float_NaN) &&
                           (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                     ::compare(&maxVal.m_backend,
                                               (cpp_dec_float<50U,_int,_void> *)&updateRow),
                           iVar27 < 0)) {
                          local_348.m_backend.data._M_elems[9]._1_3_ =
                               maxVal.m_backend.data._M_elems[9]._1_3_;
                          local_348.m_backend.data._M_elems._32_5_ =
                               maxVal.m_backend.data._M_elems._32_5_;
                          local_348.m_backend.data._M_elems[7]._1_3_ =
                               maxVal.m_backend.data._M_elems[7]._1_3_;
                          local_348.m_backend.data._M_elems._24_5_ =
                               maxVal.m_backend.data._M_elems._24_5_;
                          local_348.m_backend.data._M_elems[4] = maxVal.m_backend.data._M_elems[4];
                          local_348.m_backend.data._M_elems[5] = maxVal.m_backend.data._M_elems[5];
                          local_348.m_backend.data._M_elems[0] = maxVal.m_backend.data._M_elems[0];
                          local_348.m_backend.data._M_elems[1] = maxVal.m_backend.data._M_elems[1];
                          local_348.m_backend.data._M_elems[2] = maxVal.m_backend.data._M_elems[2];
                          local_348.m_backend.data._M_elems[3] = maxVal.m_backend.data._M_elems[3];
                          local_348.m_backend.exp = maxVal.m_backend.exp;
                          local_348.m_backend.neg = maxVal.m_backend.neg;
                          local_348.m_backend.fpclass = maxVal.m_backend.fpclass;
                          local_348.m_backend.prec_elem = maxVal.m_backend.prec_elem;
                          local_588.m_backend.data._M_elems[0] = local_648[0];
                          local_588.m_backend.data._M_elems[1] = local_648[1];
                          local_588.m_backend.data._M_elems[2] = auStack_640[0];
                          local_588.m_backend.data._M_elems[3] = auStack_640[1];
                          local_588.m_backend.data._M_elems[4] = local_638[0];
                          local_588.m_backend.data._M_elems[5] = local_638[1];
                          local_588.m_backend.data._M_elems[6] = auStack_630[0];
                          local_588.m_backend.data._M_elems[7] = auStack_630[1];
                          local_588.m_backend.data._M_elems[8] = local_628[0];
                          local_588.m_backend.data._M_elems[9] = local_628[1];
                          local_588.m_backend.exp = iVar7;
                          local_588.m_backend.neg = bVar54;
                          local_588.m_backend.fpclass = fVar8;
                          local_588.m_backend.prec_elem = iVar9;
                          feastol(&local_d8,this);
                          bVar22 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                             (&local_348,&local_588,&local_d8);
                          iVar24 = 0;
                          if (bVar22) {
                            local_980 = *(uint *)((long)(&((pIVar13->data).
                                                                                                                      
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar52);
                            iVar24 = 8;
                            bVar44 = false;
                          }
                          goto LAB_002f4273;
                        }
                      }
                    }
                    iVar24 = 0;
                  }
                }
              }
LAB_002f4273:
              if ((iVar24 != 10) && (iVar24 != 0)) break;
              lVar50 = lVar50 + 1;
              lVar52 = lVar52 + 0x3c;
            } while (lVar50 < (pIVar13->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused);
          }
          if (-1 < (int)local_980) {
            this_01 = (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.theitem +
                      (lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thekey[local_980].idx;
            pVVar37 = &(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right;
            if (bVar44) {
              pVVar37 = &(lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).left;
            }
            pnVar45 = (pVVar37->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar14 = *(undefined8 *)(pnVar45[local_980].m_backend.data._M_elems + 8);
            lhs.m_backend.data._M_elems._32_5_ = SUB85(uVar14,0);
            lhs.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar45[local_980].m_backend.data;
            lhs.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(pnVar45[local_980].m_backend.data._M_elems + 2);
            puVar2 = pnVar45[local_980].m_backend.data._M_elems + 4;
            lhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar14 = *(undefined8 *)(puVar2 + 2);
            lhs.m_backend.data._M_elems._24_5_ = SUB85(uVar14,0);
            lhs.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            lhs.m_backend.exp = pnVar45[local_980].m_backend.exp;
            lhs.m_backend.neg = pnVar45[local_980].m_backend.neg;
            lhs.m_backend.fpclass = pnVar45[local_980].m_backend.fpclass;
            lhs.m_backend.prec_elem = pnVar45[local_980].m_backend.prec_elem;
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[](&rhs,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)this_01,iVar34);
            this_00 = (MultiAggregationPS *)operator_new(0x160);
            local_388.m_backend.data._M_elems[9]._1_3_ = lhs.m_backend.data._M_elems[9]._1_3_;
            local_388.m_backend.data._M_elems._32_5_ = lhs.m_backend.data._M_elems._32_5_;
            local_388.m_backend.data._M_elems[7]._1_3_ = lhs.m_backend.data._M_elems[7]._1_3_;
            local_388.m_backend.data._M_elems._24_5_ = lhs.m_backend.data._M_elems._24_5_;
            local_388.m_backend.data._M_elems[4] = lhs.m_backend.data._M_elems[4];
            local_388.m_backend.data._M_elems[5] = lhs.m_backend.data._M_elems[5];
            local_388.m_backend.data._M_elems[0] = lhs.m_backend.data._M_elems[0];
            local_388.m_backend.data._M_elems[1] = lhs.m_backend.data._M_elems[1];
            local_388.m_backend.data._M_elems[2] = lhs.m_backend.data._M_elems[2];
            local_388.m_backend.data._M_elems[3] = lhs.m_backend.data._M_elems[3];
            local_388.m_backend.exp = lhs.m_backend.exp;
            local_388.m_backend.neg = lhs.m_backend.neg;
            local_388.m_backend.fpclass = lhs.m_backend.fpclass;
            local_388.m_backend.prec_elem = lhs.m_backend.prec_elem;
            local_688.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            local_688.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (local_688.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_688.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_688.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_688.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_688.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            MultiAggregationPS::MultiAggregationPS
                      (this_00,lp,this,local_980,iVar34,&local_388,&local_688);
            ptr.
            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)this_00;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::MultiAggregationPS*>
                      (&ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,this_00);
            if (local_688.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_688.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
            ::push_back(&local_658->data,&ptr);
            if (0 < (pIVar13->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
              lVar50 = 0;
              do {
                uVar51 = (pIVar13->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .m_elem[lVar50].idx;
                lVar52 = (long)(int)uVar51;
                if (uVar51 != local_980) {
                  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::VectorBase(&updateRow,
                               (lp->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set.thenum);
                  iVar23 = (pIVar13->data).
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .m_elem[lVar50].idx;
                  pnVar45 = (lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).right.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar14 = *(undefined8 *)(pnVar45[iVar23].m_backend.data._M_elems + 8);
                  maxVal.m_backend.data._M_elems._32_5_ = SUB85(uVar14,0);
                  maxVal.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
                  maxVal.m_backend.data._M_elems._0_8_ =
                       *(undefined8 *)&pnVar45[iVar23].m_backend.data;
                  maxVal.m_backend.data._M_elems._8_8_ =
                       *(undefined8 *)(pnVar45[iVar23].m_backend.data._M_elems + 2);
                  puVar2 = pnVar45[iVar23].m_backend.data._M_elems + 4;
                  maxVal.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                  uVar14 = *(undefined8 *)(puVar2 + 2);
                  maxVal.m_backend.data._M_elems._24_5_ = SUB85(uVar14,0);
                  maxVal.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
                  iVar34 = pnVar45[iVar23].m_backend.exp;
                  bVar3 = pnVar45[iVar23].m_backend.neg;
                  local_678 = pnVar45[iVar23].m_backend.fpclass;
                  iStack_674 = pnVar45[iVar23].m_backend.prec_elem;
                  uStack_670 = 0;
                  pnVar45 = (lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).left.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar14 = *(undefined8 *)(pnVar45[iVar23].m_backend.data._M_elems + 8);
                  local_708.data._M_elems._32_5_ = SUB85(uVar14,0);
                  local_708.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
                  local_708.data._M_elems._0_8_ = *(undefined8 *)&pnVar45[iVar23].m_backend.data;
                  local_708.data._M_elems._8_8_ =
                       *(undefined8 *)(pnVar45[iVar23].m_backend.data._M_elems + 2);
                  puVar2 = pnVar45[iVar23].m_backend.data._M_elems + 4;
                  local_708.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                  uVar14 = *(undefined8 *)(puVar2 + 2);
                  local_708.data._M_elems._24_5_ = SUB85(uVar14,0);
                  local_708.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
                  iVar7 = pnVar45[iVar23].m_backend.exp;
                  bVar44 = pnVar45[iVar23].m_backend.neg;
                  pIVar30 = (lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.theitem +
                            (lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thekey[iVar23].idx;
                  uVar14._0_4_ = pnVar45[iVar23].m_backend.fpclass;
                  uVar14._4_4_ = pnVar45[iVar23].m_backend.prec_elem;
                  for (pnVar45 = updateRow.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      pnVar45 !=
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pnVar45 = pnVar45 + 1) {
                    (pnVar45->m_backend).fpclass = cpp_dec_float_finite;
                    (pnVar45->m_backend).prec_elem = 10;
                    (pnVar45->m_backend).data._M_elems[0] = 0;
                    (pnVar45->m_backend).data._M_elems[1] = 0;
                    (pnVar45->m_backend).data._M_elems[2] = 0;
                    (pnVar45->m_backend).data._M_elems[3] = 0;
                    (pnVar45->m_backend).data._M_elems[4] = 0;
                    (pnVar45->m_backend).data._M_elems[5] = 0;
                    (pnVar45->m_backend).data._M_elems[6] = 0;
                    (pnVar45->m_backend).data._M_elems[7] = 0;
                    *(undefined8 *)((long)(pnVar45->m_backend).data._M_elems + 0x1d) = 0;
                    *(undefined8 *)((long)(pnVar45->m_backend).data._M_elems + 0x25) = 0;
                  }
                  if (0 < (pIVar30->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused) {
                    lVar39 = 0x38;
                    lVar46 = 0;
                    do {
                      pNVar43 = (pIVar30->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem;
                      iVar23 = *(int *)((long)(pNVar43->val).m_backend.data._M_elems + lVar39);
                      *(undefined8 *)
                       (updateRow.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend.data._M_elems +
                       8) = *(undefined8 *)
                             ((long)(pNVar43->val).m_backend.data._M_elems + lVar39 + -0x18);
                      puVar2 = (uint *)((long)(&pNVar43->val + -1) + lVar39);
                      uVar51 = *puVar2;
                      uVar12 = puVar2[1];
                      uVar18 = puVar2[2];
                      uVar19 = puVar2[3];
                      puVar1 = (undefined8 *)((long)(&(pNVar43->val).m_backend.data + -1) + lVar39);
                      uVar15 = puVar1[1];
                      puVar2 = updateRow.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend.data.
                               _M_elems + 4;
                      *(undefined8 *)puVar2 = *puVar1;
                      *(undefined8 *)(puVar2 + 2) = uVar15;
                      pnVar45 = updateRow.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar23;
                      (pnVar45->m_backend).data._M_elems[0] = uVar51;
                      (pnVar45->m_backend).data._M_elems[1] = uVar12;
                      (pnVar45->m_backend).data._M_elems[2] = uVar18;
                      (pnVar45->m_backend).data._M_elems[3] = uVar19;
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend.exp =
                           *(int *)((long)(pNVar43->val).m_backend.data._M_elems + lVar39 + -0x10);
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend.neg =
                           *(bool *)((long)(pNVar43->val).m_backend.data._M_elems + lVar39 + -0xc);
                      uVar15 = *(undefined8 *)
                                ((long)(pNVar43->val).m_backend.data._M_elems + lVar39 + -8);
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend.fpclass =
                           (int)uVar15;
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar23].m_backend.prec_elem =
                           (int)((ulong)uVar15 >> 0x20);
                      lVar46 = lVar46 + 1;
                      lVar39 = lVar39 + 0x3c;
                    } while (lVar46 < (pIVar30->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .memused);
                  }
                  if (0 < (this_01->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused) {
                    lVar39 = 0;
                    do {
                      pnVar45 = updateRow.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      uVar51 = (this_01->data).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem[lVar39].idx;
                      if (local_940 != uVar51) {
                        pIVar30 = (lp->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .set.theitem;
                        iVar23 = (lp->
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thekey[lVar52].idx;
                        pNVar43 = pIVar30[iVar23].data.
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem;
                        if ((pNVar43 ==
                             (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)0x0) ||
                           (uVar53 = (ulong)pIVar30[iVar23].data.
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            .memused, (long)uVar53 < 1)) {
LAB_002f487c:
                          iVar23 = -1;
                        }
                        else {
                          if (pNVar43->idx == uVar51) {
                            bVar54 = true;
                            uVar31 = 0;
                          }
                          else {
                            uVar31 = 0;
                            piVar38 = &pNVar43[1].idx;
                            do {
                              if (uVar53 - 1 == uVar31) goto LAB_002f487c;
                              uVar31 = uVar31 + 1;
                              uVar12 = *piVar38;
                              piVar38 = piVar38 + 0xf;
                            } while (uVar12 != uVar51);
                            bVar54 = uVar31 < uVar53;
                          }
                          iVar23 = (int)uVar31;
                          if (!bVar54) goto LAB_002f487c;
                        }
                        if (iVar23 < 0) {
                          pnVar41 = updateRow.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + local_940;
                          minVal.m_backend.fpclass = cpp_dec_float_finite;
                          minVal.m_backend.prec_elem = 10;
                          minVal.m_backend.data._M_elems[0] = 0;
                          minVal.m_backend.data._M_elems[1] = 0;
                          minVal.m_backend.data._M_elems[2] = 0;
                          minVal.m_backend.data._M_elems[3] = 0;
                          minVal.m_backend.data._M_elems[4] = 0;
                          minVal.m_backend.data._M_elems[5] = 0;
                          minVal.m_backend.data._M_elems._24_5_ = 0;
                          minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                          minVal.m_backend.data._M_elems._32_5_ = 0;
                          minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                          minVal.m_backend.exp = 0;
                          minVal.m_backend.neg = false;
                          t.m_backend.fpclass = cpp_dec_float_finite;
                          t.m_backend.prec_elem = 10;
                          t.m_backend.data._M_elems[0] = 0;
                          t.m_backend.data._M_elems[1] = 0;
                          t.m_backend.data._M_elems[2] = 0;
                          t.m_backend.data._M_elems[3] = 0;
                          t.m_backend.data._M_elems[4] = 0;
                          t.m_backend.data._M_elems[5] = 0;
                          t.m_backend.data._M_elems._24_5_ = 0;
                          t.m_backend.data._M_elems[7]._1_3_ = 0;
                          t.m_backend.data._M_elems._32_5_ = 0;
                          t.m_backend.data._M_elems[9]._1_3_ = 0;
                          t.m_backend.exp = 0;
                          t.m_backend.neg = false;
                          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                    ((cpp_dec_float<50u,int,void> *)&t,-1.0);
                          if (&minVal != pnVar41) {
                            uVar15 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 8);
                            minVal.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                            minVal.m_backend.data._M_elems[9]._1_3_ =
                                 (undefined3)((ulong)uVar15 >> 0x28);
                            minVal.m_backend.data._M_elems._0_8_ =
                                 *(undefined8 *)(pnVar41->m_backend).data._M_elems;
                            minVal.m_backend.data._M_elems._8_8_ =
                                 *(undefined8 *)((pnVar41->m_backend).data._M_elems + 2);
                            minVal.m_backend.data._M_elems._16_8_ =
                                 *(undefined8 *)((pnVar41->m_backend).data._M_elems + 4);
                            uVar15 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 6);
                            minVal.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                            minVal.m_backend.data._M_elems[7]._1_3_ =
                                 (undefined3)((ulong)uVar15 >> 0x28);
                            minVal.m_backend.exp = (pnVar41->m_backend).exp;
                            minVal.m_backend.neg = (pnVar41->m_backend).neg;
                            minVal.m_backend.fpclass = (pnVar41->m_backend).fpclass;
                            minVal.m_backend.prec_elem = (pnVar41->m_backend).prec_elem;
                          }
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                    (&minVal.m_backend,&t.m_backend);
                          pNVar32 = (this_01->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + lVar39;
                          maxRes.m_backend.fpclass = cpp_dec_float_finite;
                          maxRes.m_backend.prec_elem = 10;
                          maxRes.m_backend.data._M_elems[0] = 0;
                          maxRes.m_backend.data._M_elems[1] = 0;
                          maxRes.m_backend.data._M_elems[2] = 0;
                          maxRes.m_backend.data._M_elems[3] = 0;
                          maxRes.m_backend.data._M_elems[4] = 0;
                          maxRes.m_backend.data._M_elems[5] = 0;
                          maxRes.m_backend.data._M_elems._24_5_ = 0;
                          maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                          maxRes.m_backend.data._M_elems._32_5_ = 0;
                          maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                          maxRes.m_backend.exp = 0;
                          maxRes.m_backend.neg = false;
                          pNVar43 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)&minVal;
                          if ((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)&maxRes != pNVar32) {
                            maxRes.m_backend.data._M_elems._32_5_ =
                                 minVal.m_backend.data._M_elems._32_5_;
                            maxRes.m_backend.data._M_elems[9]._1_3_ =
                                 minVal.m_backend.data._M_elems[9]._1_3_;
                            maxRes.m_backend.data._M_elems[4] = minVal.m_backend.data._M_elems[4];
                            maxRes.m_backend.data._M_elems[5] = minVal.m_backend.data._M_elems[5];
                            maxRes.m_backend.data._M_elems._24_5_ =
                                 minVal.m_backend.data._M_elems._24_5_;
                            maxRes.m_backend.data._M_elems[7]._1_3_ =
                                 minVal.m_backend.data._M_elems[7]._1_3_;
                            maxRes.m_backend.data._M_elems[0] = minVal.m_backend.data._M_elems[0];
                            maxRes.m_backend.data._M_elems[1] = minVal.m_backend.data._M_elems[1];
                            maxRes.m_backend.data._M_elems[2] = minVal.m_backend.data._M_elems[2];
                            maxRes.m_backend.data._M_elems[3] = minVal.m_backend.data._M_elems[3];
                            maxRes.m_backend.exp = minVal.m_backend.exp;
                            maxRes.m_backend.neg = minVal.m_backend.neg;
                            maxRes.m_backend.fpclass = minVal.m_backend.fpclass;
                            maxRes.m_backend.prec_elem = minVal.m_backend.prec_elem;
                            pNVar43 = pNVar32;
                          }
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                    (&maxRes.m_backend,(cpp_dec_float<50U,_int,_void> *)pNVar43);
                          minRes.m_backend.fpclass = cpp_dec_float_finite;
                          minRes.m_backend.prec_elem = 10;
                          minRes.m_backend.data._M_elems[0] = 0;
                          minRes.m_backend.data._M_elems[1] = 0;
                          minRes.m_backend.data._M_elems[2] = 0;
                          minRes.m_backend.data._M_elems[3] = 0;
                          minRes.m_backend.data._M_elems[4] = 0;
                          minRes.m_backend.data._M_elems[5] = 0;
                          minRes.m_backend.data._M_elems._24_5_ = 0;
                          minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                          minRes.m_backend.data._M_elems._32_5_ = 0;
                          minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                          minRes.m_backend.exp = 0;
                          minRes.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend);
                          (*(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray[0x43])(lp,lVar52,(ulong)uVar51,&minRes,0);
                        }
                        else {
                          iVar23 = (this_01->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem[lVar39].idx;
                          pNVar32 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)(updateRow.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + local_940);
                          pNVar42 = (this_01->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem + lVar39;
                          maxRes.m_backend.fpclass = cpp_dec_float_finite;
                          maxRes.m_backend.prec_elem = 10;
                          maxRes.m_backend.data._M_elems[0] = 0;
                          maxRes.m_backend.data._M_elems[1] = 0;
                          maxRes.m_backend.data._M_elems[2] = 0;
                          maxRes.m_backend.data._M_elems[3] = 0;
                          maxRes.m_backend.data._M_elems[4] = 0;
                          maxRes.m_backend.data._M_elems[5] = 0;
                          maxRes.m_backend.data._M_elems._24_5_ = 0;
                          maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                          maxRes.m_backend.data._M_elems._32_5_ = 0;
                          maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                          maxRes.m_backend.exp = 0;
                          maxRes.m_backend.neg = false;
                          pNVar43 = pNVar32;
                          if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)&maxRes != pNVar42) &&
                             (pNVar43 = pNVar42,
                             (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)&maxRes != pNVar32)) {
                            uVar15 = *(undefined8 *)((pNVar32->val).m_backend.data._M_elems + 8);
                            maxRes.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                            maxRes.m_backend.data._M_elems[9]._1_3_ =
                                 (undefined3)((ulong)uVar15 >> 0x28);
                            maxRes.m_backend.data._M_elems._0_8_ =
                                 *(undefined8 *)(pNVar32->val).m_backend.data._M_elems;
                            maxRes.m_backend.data._M_elems._8_8_ =
                                 *(undefined8 *)((pNVar32->val).m_backend.data._M_elems + 2);
                            maxRes.m_backend.data._M_elems._16_8_ =
                                 *(undefined8 *)((pNVar32->val).m_backend.data._M_elems + 4);
                            uVar15 = *(undefined8 *)((pNVar32->val).m_backend.data._M_elems + 6);
                            maxRes.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                            maxRes.m_backend.data._M_elems[7]._1_3_ =
                                 (undefined3)((ulong)uVar15 >> 0x28);
                            maxRes.m_backend.exp = *(int *)(&(pNVar32->val).m_backend.data + 1);
                            maxRes.m_backend.neg =
                                 *(bool *)((long)(&(pNVar32->val).m_backend.data + 1) + 4);
                            maxRes.m_backend._48_8_ =
                                 *(undefined8 *)((long)(&(pNVar32->val).m_backend.data + 1) + 8);
                          }
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                    (&maxRes.m_backend,(cpp_dec_float<50U,_int,_void> *)pNVar43);
                          minRes.m_backend.fpclass = cpp_dec_float_finite;
                          minRes.m_backend.prec_elem = 10;
                          minRes.m_backend.data._M_elems[0] = 0;
                          minRes.m_backend.data._M_elems[1] = 0;
                          minRes.m_backend.data._M_elems[2] = 0;
                          minRes.m_backend.data._M_elems[3] = 0;
                          minRes.m_backend.data._M_elems[4] = 0;
                          minRes.m_backend.data._M_elems[5] = 0;
                          minRes.m_backend.data._M_elems._24_5_ = 0;
                          minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                          minRes.m_backend.data._M_elems._32_5_ = 0;
                          minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                          minRes.m_backend.exp = 0;
                          minRes.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend);
                          ptVar49 = (type *)(pnVar45 + iVar23);
                          t.m_backend.fpclass = cpp_dec_float_finite;
                          t.m_backend.prec_elem = 10;
                          t.m_backend.data._M_elems[0] = 0;
                          t.m_backend.data._M_elems[1] = 0;
                          t.m_backend.data._M_elems[2] = 0;
                          t.m_backend.data._M_elems[3] = 0;
                          t.m_backend.data._M_elems[4] = 0;
                          t.m_backend.data._M_elems[5] = 0;
                          t.m_backend.data._M_elems._24_5_ = 0;
                          t.m_backend.data._M_elems[7]._1_3_ = 0;
                          t.m_backend.data._M_elems._32_5_ = 0;
                          t.m_backend.data._M_elems[9]._1_3_ = 0;
                          t.m_backend.exp = 0;
                          t.m_backend.neg = false;
                          if (&t != ptVar49) {
                            uVar15 = *(undefined8 *)((ptVar49->m_backend).data._M_elems + 8);
                            t.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                            t.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28)
                            ;
                            t.m_backend.data._M_elems._0_8_ =
                                 *(undefined8 *)(ptVar49->m_backend).data._M_elems;
                            t.m_backend.data._M_elems._8_8_ =
                                 *(undefined8 *)((ptVar49->m_backend).data._M_elems + 2);
                            t.m_backend.data._M_elems._16_8_ =
                                 *(undefined8 *)((ptVar49->m_backend).data._M_elems + 4);
                            uVar15 = *(undefined8 *)((ptVar49->m_backend).data._M_elems + 6);
                            t.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                            t.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28)
                            ;
                            t.m_backend.exp = (ptVar49->m_backend).exp;
                            t.m_backend.neg = (ptVar49->m_backend).neg;
                            t.m_backend.fpclass = (ptVar49->m_backend).fpclass;
                            t.m_backend.prec_elem = (ptVar49->m_backend).prec_elem;
                          }
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                                    (&t.m_backend,&minRes.m_backend);
                          (*(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray[0x43])(lp,lVar52,(ulong)uVar51,&t);
                        }
                      }
                      lVar39 = lVar39 + 1;
                    } while (lVar39 < (this_01->data).
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      .memused);
                  }
                  pcVar48 = &(lp->
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).right.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar52].m_backend;
                  ::soplex::infinity::__tls_init();
                  t.m_backend.fpclass = cpp_dec_float_finite;
                  t.m_backend.prec_elem = 10;
                  t.m_backend.data._M_elems[0] = 0;
                  t.m_backend.data._M_elems[1] = 0;
                  t.m_backend.data._M_elems[2] = 0;
                  t.m_backend.data._M_elems[3] = 0;
                  t.m_backend.data._M_elems[4] = 0;
                  t.m_backend.data._M_elems[5] = 0;
                  t.m_backend.data._M_elems._24_5_ = 0;
                  t.m_backend.data._M_elems[7]._1_3_ = 0;
                  t.m_backend.data._M_elems._32_5_ = 0;
                  t.m_backend.data._M_elems[9]._1_3_ = 0;
                  t.m_backend.exp = 0;
                  t.m_backend.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&t.m_backend,a);
                  if (((pcVar48->fpclass != cpp_dec_float_NaN) &&
                      (t.m_backend.fpclass != cpp_dec_float_NaN)) &&
                     (iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar48,&t.m_backend), iVar23 < 0)) {
                    pnVar41 = updateRow.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_940;
                    maxRes.m_backend.fpclass = cpp_dec_float_finite;
                    maxRes.m_backend.prec_elem = 10;
                    maxRes.m_backend.data._M_elems[0] = 0;
                    maxRes.m_backend.data._M_elems[1] = 0;
                    maxRes.m_backend.data._M_elems[2] = 0;
                    maxRes.m_backend.data._M_elems[3] = 0;
                    maxRes.m_backend.data._M_elems[4] = 0;
                    maxRes.m_backend.data._M_elems[5] = 0;
                    maxRes.m_backend.data._M_elems._24_5_ = 0;
                    maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                    maxRes.m_backend.data._M_elems._32_5_ = 0;
                    maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                    maxRes.m_backend.exp = 0;
                    maxRes.m_backend.neg = false;
                    if (&maxRes != pnVar41) {
                      uVar15 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 8);
                      maxRes.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                      maxRes.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
                      maxRes.m_backend.data._M_elems._0_8_ =
                           *(undefined8 *)(pnVar41->m_backend).data._M_elems;
                      maxRes.m_backend.data._M_elems._8_8_ =
                           *(undefined8 *)((pnVar41->m_backend).data._M_elems + 2);
                      maxRes.m_backend.data._M_elems._16_8_ =
                           *(undefined8 *)((pnVar41->m_backend).data._M_elems + 4);
                      uVar15 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 6);
                      maxRes.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                      maxRes.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
                      maxRes.m_backend.exp = (pnVar41->m_backend).exp;
                      maxRes.m_backend.neg = (pnVar41->m_backend).neg;
                      maxRes.m_backend.fpclass = (pnVar41->m_backend).fpclass;
                      maxRes.m_backend.prec_elem = (pnVar41->m_backend).prec_elem;
                    }
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                              (&maxRes.m_backend,&lhs.m_backend);
                    minRes.m_backend.fpclass = cpp_dec_float_finite;
                    minRes.m_backend.prec_elem = 10;
                    minRes.m_backend.data._M_elems[0] = 0;
                    minRes.m_backend.data._M_elems[1] = 0;
                    minRes.m_backend.data._M_elems[2] = 0;
                    minRes.m_backend.data._M_elems[3] = 0;
                    minRes.m_backend.data._M_elems[4] = 0;
                    minRes.m_backend.data._M_elems[5] = 0;
                    minRes.m_backend.data._M_elems._24_5_ = 0;
                    minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                    minRes.m_backend.data._M_elems._32_5_ = 0;
                    minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                    minRes.m_backend.exp = 0;
                    minRes.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend);
                    t.m_backend.data._M_elems._32_5_ = maxVal.m_backend.data._M_elems._32_5_;
                    t.m_backend.data._M_elems[9]._1_3_ = maxVal.m_backend.data._M_elems[9]._1_3_;
                    t.m_backend.data._M_elems[4] = maxVal.m_backend.data._M_elems[4];
                    t.m_backend.data._M_elems[5] = maxVal.m_backend.data._M_elems[5];
                    t.m_backend.data._M_elems._24_5_ = maxVal.m_backend.data._M_elems._24_5_;
                    t.m_backend.data._M_elems[7]._1_3_ = maxVal.m_backend.data._M_elems[7]._1_3_;
                    t.m_backend.data._M_elems[0] = maxVal.m_backend.data._M_elems[0];
                    t.m_backend.data._M_elems[1] = maxVal.m_backend.data._M_elems[1];
                    t.m_backend.data._M_elems[2] = maxVal.m_backend.data._M_elems[2];
                    t.m_backend.data._M_elems[3] = maxVal.m_backend.data._M_elems[3];
                    t.m_backend.fpclass = local_678;
                    t.m_backend.prec_elem = iStack_674;
                    t.m_backend.exp = iVar34;
                    t.m_backend.neg = bVar3;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&t.m_backend,&minRes.m_backend);
                    (*(lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._vptr_ClassArray[0x36])(lp,lVar52,&t.m_backend,0);
                  }
                  pcVar48 = &(lp->
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).left.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar52].m_backend;
                  ::soplex::infinity::__tls_init();
                  t.m_backend.fpclass = cpp_dec_float_finite;
                  t.m_backend.prec_elem = 10;
                  t.m_backend.data._M_elems[0] = 0;
                  t.m_backend.data._M_elems[1] = 0;
                  t.m_backend.data._M_elems[2] = 0;
                  t.m_backend.data._M_elems[3] = 0;
                  t.m_backend.data._M_elems[4] = 0;
                  t.m_backend.data._M_elems[5] = 0;
                  t.m_backend.data._M_elems._24_5_ = 0;
                  t.m_backend.data._M_elems[7]._1_3_ = 0;
                  t.m_backend.data._M_elems._32_5_ = 0;
                  t.m_backend.data._M_elems[9]._1_3_ = 0;
                  t.m_backend.exp = 0;
                  t.m_backend.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&t.m_backend,-a);
                  if (((pcVar48->fpclass != cpp_dec_float_NaN) &&
                      (t.m_backend.fpclass != cpp_dec_float_NaN)) &&
                     (iVar23 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar48,&t.m_backend), 0 < iVar23)) {
                    pnVar41 = updateRow.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + local_940;
                    maxRes.m_backend.fpclass = cpp_dec_float_finite;
                    maxRes.m_backend.prec_elem = 10;
                    maxRes.m_backend.data._M_elems[0] = 0;
                    maxRes.m_backend.data._M_elems[1] = 0;
                    maxRes.m_backend.data._M_elems[2] = 0;
                    maxRes.m_backend.data._M_elems[3] = 0;
                    maxRes.m_backend.data._M_elems[4] = 0;
                    maxRes.m_backend.data._M_elems[5] = 0;
                    maxRes.m_backend.data._M_elems._24_5_ = 0;
                    maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                    maxRes.m_backend.data._M_elems._32_5_ = 0;
                    maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                    maxRes.m_backend.exp = 0;
                    maxRes.m_backend.neg = false;
                    if (&maxRes != pnVar41) {
                      uVar15 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 8);
                      maxRes.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                      maxRes.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
                      maxRes.m_backend.data._M_elems._0_8_ =
                           *(undefined8 *)(pnVar41->m_backend).data._M_elems;
                      maxRes.m_backend.data._M_elems._8_8_ =
                           *(undefined8 *)((pnVar41->m_backend).data._M_elems + 2);
                      maxRes.m_backend.data._M_elems._16_8_ =
                           *(undefined8 *)((pnVar41->m_backend).data._M_elems + 4);
                      uVar15 = *(undefined8 *)((pnVar41->m_backend).data._M_elems + 6);
                      maxRes.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                      maxRes.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
                      maxRes.m_backend.exp = (pnVar41->m_backend).exp;
                      maxRes.m_backend.neg = (pnVar41->m_backend).neg;
                      maxRes.m_backend.fpclass = (pnVar41->m_backend).fpclass;
                      maxRes.m_backend.prec_elem = (pnVar41->m_backend).prec_elem;
                    }
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                              (&maxRes.m_backend,&lhs.m_backend);
                    minRes.m_backend.fpclass = cpp_dec_float_finite;
                    minRes.m_backend.prec_elem = 10;
                    minRes.m_backend.data._M_elems[0] = 0;
                    minRes.m_backend.data._M_elems[1] = 0;
                    minRes.m_backend.data._M_elems[2] = 0;
                    minRes.m_backend.data._M_elems[3] = 0;
                    minRes.m_backend.data._M_elems[4] = 0;
                    minRes.m_backend.data._M_elems[5] = 0;
                    minRes.m_backend.data._M_elems._24_5_ = 0;
                    minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                    minRes.m_backend.data._M_elems._32_5_ = 0;
                    minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                    minRes.m_backend.exp = 0;
                    minRes.m_backend.neg = false;
                    boost::multiprecision::default_ops::
                    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                              (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend);
                    t.m_backend.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                    t.m_backend.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                    t.m_backend.data._M_elems[4] = local_708.data._M_elems[4];
                    t.m_backend.data._M_elems[5] = local_708.data._M_elems[5];
                    t.m_backend.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                    t.m_backend.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                    t.m_backend.data._M_elems[0] = local_708.data._M_elems[0];
                    t.m_backend.data._M_elems[1] = local_708.data._M_elems[1];
                    t.m_backend.data._M_elems[2] = local_708.data._M_elems[2];
                    t.m_backend.data._M_elems[3] = local_708.data._M_elems[3];
                    t.m_backend.exp = iVar7;
                    t.m_backend.neg = bVar44;
                    t.m_backend._48_8_ = uVar14;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&t.m_backend,&minRes.m_backend);
                    (*(lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._vptr_ClassArray[0x33])(lp,lVar52,&t.m_backend,0);
                  }
                  if (updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(updateRow.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)updateRow.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)updateRow.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                lVar50 = lVar50 + 1;
              } while (lVar50 < (pIVar13->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused);
            }
            if (0 < (this_01->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
              lVar50 = 0;
              lVar52 = 0;
              do {
                uVar51 = *(uint *)((long)(&((this_01->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           .m_elem)->val + 1) + lVar50);
                if (local_940 != uVar51) {
                  iVar23 = *(int *)((long)(&((this_01->data).
                                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            .m_elem)->val + 1) + lVar50);
                  pnVar45 = (lp->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  pcVar33 = &pnVar45[local_940].m_backend;
                  pcVar47 = (cpp_dec_float<50U,_int,_void> *)
                            ((long)(((this_01->data).
                                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem)->val).m_backend.data._M_elems + lVar50);
                  maxRes.m_backend.fpclass = cpp_dec_float_finite;
                  maxRes.m_backend.prec_elem = 10;
                  maxRes.m_backend.data._M_elems[0] = 0;
                  maxRes.m_backend.data._M_elems[1] = 0;
                  maxRes.m_backend.data._M_elems[2] = 0;
                  maxRes.m_backend.data._M_elems[3] = 0;
                  maxRes.m_backend.data._M_elems[4] = 0;
                  maxRes.m_backend.data._M_elems[5] = 0;
                  maxRes.m_backend.data._M_elems._24_5_ = 0;
                  maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                  maxRes.m_backend.data._M_elems._32_5_ = 0;
                  maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                  maxRes.m_backend.exp = 0;
                  maxRes.m_backend.neg = false;
                  pcVar48 = pcVar33;
                  if ((pcVar47 != &maxRes.m_backend) &&
                     (pcVar48 = pcVar47, &maxRes.m_backend != pcVar33)) {
                    uVar14 = *(undefined8 *)
                              ((((cpp_dec_float<50U,_int,_void> *)&pcVar33->data)->data)._M_elems +
                              8);
                    maxRes.m_backend.data._M_elems._32_5_ = SUB85(uVar14,0);
                    maxRes.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
                    maxRes.m_backend.data._M_elems._0_8_ =
                         *(undefined8 *)
                          (((cpp_dec_float<50U,_int,_void> *)&pcVar33->data)->data)._M_elems;
                    maxRes.m_backend.data._M_elems._8_8_ =
                         *(undefined8 *)
                          ((((cpp_dec_float<50U,_int,_void> *)&pcVar33->data)->data)._M_elems + 2);
                    maxRes.m_backend.data._M_elems._16_8_ =
                         *(undefined8 *)
                          ((((cpp_dec_float<50U,_int,_void> *)&pcVar33->data)->data)._M_elems + 4);
                    uVar14 = *(undefined8 *)
                              ((((cpp_dec_float<50U,_int,_void> *)&pcVar33->data)->data)._M_elems +
                              6);
                    maxRes.m_backend.data._M_elems._24_5_ = SUB85(uVar14,0);
                    maxRes.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
                    maxRes.m_backend.exp = pcVar33->exp;
                    maxRes.m_backend.neg = pcVar33->neg;
                    maxRes.m_backend.fpclass = pcVar33->fpclass;
                    maxRes.m_backend.prec_elem = pcVar33->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                            (&maxRes.m_backend,pcVar48);
                  minRes.m_backend.fpclass = cpp_dec_float_finite;
                  minRes.m_backend.prec_elem = 10;
                  minRes.m_backend.data._M_elems[0] = 0;
                  minRes.m_backend.data._M_elems[1] = 0;
                  minRes.m_backend.data._M_elems[2] = 0;
                  minRes.m_backend.data._M_elems[3] = 0;
                  minRes.m_backend.data._M_elems[4] = 0;
                  minRes.m_backend.data._M_elems[5] = 0;
                  minRes.m_backend.data._M_elems._24_5_ = 0;
                  minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                  minRes.m_backend.data._M_elems._32_5_ = 0;
                  minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                  minRes.m_backend.exp = 0;
                  minRes.m_backend.neg = false;
                  boost::multiprecision::default_ops::
                  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                            (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend);
                  ptVar49 = (type *)(pnVar45 + iVar23);
                  t.m_backend.fpclass = cpp_dec_float_finite;
                  t.m_backend.prec_elem = 10;
                  t.m_backend.data._M_elems[0] = 0;
                  t.m_backend.data._M_elems[1] = 0;
                  t.m_backend.data._M_elems[2] = 0;
                  t.m_backend.data._M_elems[3] = 0;
                  t.m_backend.data._M_elems[4] = 0;
                  t.m_backend.data._M_elems[5] = 0;
                  t.m_backend.data._M_elems._24_5_ = 0;
                  t.m_backend.data._M_elems[7]._1_3_ = 0;
                  t.m_backend.data._M_elems._32_5_ = 0;
                  t.m_backend.data._M_elems[9]._1_3_ = 0;
                  t.m_backend.exp = 0;
                  t.m_backend.neg = false;
                  if (&t != ptVar49) {
                    uVar14 = *(undefined8 *)((ptVar49->m_backend).data._M_elems + 8);
                    t.m_backend.data._M_elems._32_5_ = SUB85(uVar14,0);
                    t.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
                    t.m_backend.data._M_elems._0_8_ =
                         *(undefined8 *)(ptVar49->m_backend).data._M_elems;
                    t.m_backend.data._M_elems._8_8_ =
                         *(undefined8 *)((ptVar49->m_backend).data._M_elems + 2);
                    t.m_backend.data._M_elems._16_8_ =
                         *(undefined8 *)((ptVar49->m_backend).data._M_elems + 4);
                    uVar14 = *(undefined8 *)((ptVar49->m_backend).data._M_elems + 6);
                    t.m_backend.data._M_elems._24_5_ = SUB85(uVar14,0);
                    t.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
                    t.m_backend.exp = (ptVar49->m_backend).exp;
                    t.m_backend.neg = (ptVar49->m_backend).neg;
                    t.m_backend.fpclass = (ptVar49->m_backend).fpclass;
                    t.m_backend.prec_elem = (ptVar49->m_backend).prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&t.m_backend,&minRes.m_backend);
                  (*(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._vptr_ClassArray[0x27])(lp,(ulong)uVar51,&t,0);
                }
                lVar52 = lVar52 + 1;
                lVar50 = lVar50 + 0x3c;
              } while (lVar52 < (this_01->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused);
            }
            iVar23 = (lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem
                     [(lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thekey[local_940].idx].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            piVar38 = (this->m_cIdx).data;
            piVar38[local_940] =
                 piVar38[(long)(lp->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set.thenum + -1];
            (*(lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x15])();
            iVar34 = (lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem
                     [(lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thekey[local_980].idx].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused;
            piVar38 = (this->m_rIdx).data;
            piVar38[local_980] =
                 piVar38[(long)(lp->
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).
                               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .set.thenum + -1];
            (*(lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0xf])();
            piVar38 = (this->m_stat).data + 0x10;
            *piVar38 = *piVar38 + 1;
            if (ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (ptr.
                         super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            local_938 = local_938 + 1;
            iVar28 = iVar28 + 1;
            local_97c = local_97c + iVar23 + iVar34;
          }
        }
      }
    } while (1 < (long)local_650);
  }
  uVar51 = iVar28 + local_938;
  if (uVar51 != 0 && SCARRY4(iVar28,local_938) == (int)uVar51 < 0) {
    piVar38 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remRows;
    *piVar38 = *piVar38 + iVar28;
    piVar38 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remCols;
    *piVar38 = *piVar38 + local_938;
    piVar38 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remNzos;
    *piVar38 = *piVar38 + local_97c;
    pSVar16 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar16 != (SPxOut *)0x0) && (3 < (int)pSVar16->m_verbosity)) {
      t.m_backend.data._M_elems[0] = pSVar16->m_verbosity;
      lhs.m_backend.data._M_elems[0] = 4;
      (*pSVar16->_vptr_SPxOut[2])();
      pSVar16 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar16->m_streams[pSVar16->m_verbosity],"Simplifier (multi-aggregation) removed ",
                 0x27);
      std::ostream::operator<<((ostream *)pSVar16->m_streams[pSVar16->m_verbosity],iVar28);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar16->m_streams[pSVar16->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar16->m_streams[pSVar16->m_verbosity],local_938);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar16->m_streams[pSVar16->m_verbosity]," cols, ",7);
      std::ostream::operator<<((ostream *)pSVar16->m_streams[pSVar16->m_verbosity],local_97c);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar16->m_streams[pSVar16->m_verbosity]," non-zeros",10);
      cVar17 = (char)pSVar16->m_streams[pSVar16->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar16->m_streams[pSVar16->m_verbosity] + -0x18) + cVar17);
      std::ostream::put(cVar17);
      std::ostream::flush();
      pSVar16 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar16->_vptr_SPxOut[2])(pSVar16,&t);
    }
    lhs.m_backend.fpclass = cpp_dec_float_finite;
    lhs.m_backend.prec_elem = 10;
    lhs.m_backend.data._M_elems[0] = 0;
    lhs.m_backend.data._M_elems[1] = 0;
    lhs.m_backend.data._M_elems[2] = 0;
    lhs.m_backend.data._M_elems[3] = 0;
    lhs.m_backend.data._M_elems[4] = 0;
    lhs.m_backend.data._M_elems[5] = 0;
    lhs.m_backend.data._M_elems._24_5_ = 0;
    lhs.m_backend.data._M_elems[7]._1_3_ = 0;
    lhs.m_backend.data._M_elems._32_5_ = 0;
    lhs.m_backend.data._M_elems[9]._1_3_ = 0;
    lhs.m_backend.exp = 0;
    lhs.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&t.m_backend,iVar29 + local_660,(type *)0x0);
    pnVar41 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction;
    if (&lhs != pnVar41) {
      uVar14 = *(undefined8 *)
                ((this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.data._M_elems + 8);
      lhs.m_backend.data._M_elems._32_5_ = SUB85(uVar14,0);
      lhs.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
      lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar41->m_backend).data._M_elems;
      lhs.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)
            ((this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_minReduction.m_backend.data._M_elems + 2);
      lhs.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_minReduction.m_backend.data._M_elems + 4);
      uVar14 = *(undefined8 *)
                ((this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.data._M_elems + 6);
      lhs.m_backend.data._M_elems._24_5_ = SUB85(uVar14,0);
      lhs.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
      lhs.m_backend.exp =
           (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_minReduction.m_backend.exp;
      lhs.m_backend.neg =
           (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_minReduction.m_backend.neg;
      lhs.m_backend.fpclass =
           (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_minReduction.m_backend.fpclass;
      lhs.m_backend.prec_elem =
           (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_minReduction.m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&lhs.m_backend,&t.m_backend);
    if (lhs.m_backend.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&t.m_backend,(ulong)uVar51,(type *)0x0);
      iVar29 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&lhs.m_backend,&t.m_backend);
      if (iVar29 < 0) {
        *local_668 = true;
      }
    }
  }
  if (downLocks.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(downLocks.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)downLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)downLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (upLocks.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(upLocks.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)upLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)upLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::multiaggregation(SPxLPBase<R>& lp, bool& again)
{
   // this simplifier eliminates rows and columns by performing multi aggregations as identified by the constraint
   // activities.
   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   VectorBase<R> upLocks(lp.nCols());
   VectorBase<R> downLocks(lp.nCols());

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      // setting the locks on the variables
      upLocks[j] = 0;
      downLocks[j] = 0;

      if(lp.colVector(j).size() <= 1)
         continue;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(lp.lhs(col.index(k)) > R(-infinity) && lp.rhs(col.index(k)) < R(infinity))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(lp.lhs(col.index(k)) > R(-infinity))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(lp.rhs(col.index(k)) < R(infinity))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      // multi-aggregate column
      if(upLocks[j] == 1 || downLocks[j] == 1)
      {
         R lower = lp.lower(j);
         R upper = lp.upper(j);
         int maxOtherLocks;
         int bestpos = -1;
         bool bestislhs = true;

         for(int k = 0; k < col.size(); ++k)
         {
            int rowNumber;
            R lhs;
            R rhs;
            bool lhsExists;
            bool rhsExists;
            bool aggLhs;
            bool aggRhs;

            R val = col.value(k);

            rowNumber = col.index(k);
            lhs = lp.lhs(rowNumber);
            rhs = lp.rhs(rowNumber);

            if(EQ(lhs, rhs, feastol()))
               continue;

            lhsExists = lhs > R(-infinity);
            rhsExists = rhs < R(infinity);

            if(lp.rowVector(rowNumber).size() <= 2)
               maxOtherLocks = INT_MAX;
            else if(lp.rowVector(rowNumber).size() == 3)
               maxOtherLocks = 3;
            else if(lp.rowVector(rowNumber).size() == 4)
               maxOtherLocks = 2;
            else
               maxOtherLocks = 1;

            aggLhs = lhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks));
            aggRhs = rhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks));

            if(aggLhs || aggRhs)
            {
               R minRes = 0;   // this is the minimum value that the aggregation can attain
               R maxRes = 0;   // this is the maximum value that the aggregation can attain

               // computing the minimum and maximum residuals if variable j is set to zero.
               computeMinMaxResidualActivity(lp, rowNumber, j, minRes, maxRes);

               // we will try to aggregate to the lhs
               if(aggLhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, lhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  // if the bounds of the aggregation and the original variable are equivalent, then we can reduce
                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = true;
                     break;
                  }
               }

               // we will try to aggregate to the rhs
               if(aggRhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, rhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = false;
                     break;
                  }
               }
            }
         }

         // it is only possible to aggregate if a best position has been found
         if(bestpos >= 0)
         {
            const SVectorBase<R>& bestRow = lp.rowVector(bestpos);
            // aggregating the variable and applying the fixings to the all other constraints
            R aggConstant = (bestislhs ? lp.lhs(bestpos) : lp.rhs(
                                bestpos));   // this is the lhs or rhs of the aggregated row
            R aggAij =
               bestRow[j];                                   // this is the coefficient of the deleted col

            SPxOut::debug(this,
                          "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n",
                          j, bestpos, aggConstant, aggAij);

            std::shared_ptr<PostStep> ptr(new MultiAggregationPS(lp, *this, bestpos, j,
                                          aggConstant, this->_tolerances));
            m_hist.append(ptr);

            for(int k = 0; k < col.size(); ++k)
            {
               if(col.index(k) != bestpos)
               {
                  int rowNumber = col.index(k);
                  VectorBase<R> updateRow(lp.nCols());
                  R updateRhs = lp.rhs(col.index(k));
                  R updateLhs = lp.lhs(col.index(k));

                  updateRow = lp.rowVector(col.index(k));

                  // updating the row with the best row
                  for(int l = 0; l < bestRow.size(); l++)
                  {
                     if(bestRow.index(l) != j)
                     {
                        if(lp.rowVector(rowNumber).pos(bestRow.index(l)) >= 0)
                           lp.changeElement(rowNumber, bestRow.index(l), updateRow[bestRow.index(l)]
                                            - updateRow[j]*bestRow.value(l) / aggAij);
                        else
                           lp.changeElement(rowNumber, bestRow.index(l), -1.0 * updateRow[j]*bestRow.value(l) / aggAij);
                     }
                  }

                  // NOTE: I don't know whether we should change the LHS and RHS if they are currently at R(infinity)
                  if(lp.rhs(rowNumber) < R(infinity))
                     lp.changeRhs(rowNumber, updateRhs - updateRow[j]*aggConstant / aggAij);

                  if(lp.lhs(rowNumber) > R(-infinity))
                     lp.changeLhs(rowNumber, updateLhs - updateRow[j]*aggConstant / aggAij);

                  assert(LE(lp.lhs(rowNumber), lp.rhs(rowNumber), this->tolerances()->epsilon()));
               }
            }

            for(int l = 0; l < bestRow.size(); l++)
            {
               if(bestRow.index(l) != j)
                  lp.changeMaxObj(bestRow.index(l),
                                  lp.maxObj(bestRow.index(l)) - lp.maxObj(j)*bestRow.value(l) / aggAij);
            }

            ++remCols;
            remNzos += lp.colVector(j).size();
            removeCol(lp, j);
            ++remRows;
            remNzos += lp.rowVector(bestpos).size();
            removeRow(lp, bestpos);

            ++m_stat[MULTI_AGG];
         }
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (multi-aggregation) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}